

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O3

SampledSpectrum __thiscall
pbrt::SimpleVolPathIntegrator::Li
          (SimpleVolPathIntegrator *this,RayDifferential *ray,SampledWavelengths *lambda,
          SamplerHandle *sampler,ScratchBuffer *buf,VisibleSurface *param_5)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  uint uVar6;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  TVar7;
  Interval IVar8;
  pointer pLVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  Point3f p;
  array<float,_4> aVar70;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  RayDifferential *pRVar74;
  uint64_t uVar75;
  Interval *pIVar76;
  uint uVar77;
  undefined4 extraout_var;
  ulong uVar78;
  byte bVar79;
  ulong uVar80;
  float *pfVar81;
  uint *puVar82;
  undefined8 *puVar83;
  float *pfVar84;
  uintptr_t iptr;
  DenselySampledSpectrum *this_00;
  HaltonSampler *this_01;
  DebugMLTSampler *this_02;
  uint uVar85;
  ImageInfiniteLight *this_03;
  uint uVar86;
  uint uVar87;
  float *pfVar88;
  Ray *pRVar89;
  long lVar90;
  uint *puVar91;
  uint *puVar92;
  uint uVar93;
  uint uVar94;
  pointer pLVar95;
  long in_FS_OFFSET;
  bool bVar96;
  int iVar97;
  int iVar98;
  int iVar99;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  Float FVar106;
  float fVar107;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  Tuple2<pbrt::Point2,_float> u2;
  undefined1 auVar128 [16];
  undefined1 auVar129 [32];
  undefined8 uVar144;
  undefined1 auVar146 [56];
  undefined1 auVar130 [64];
  undefined1 auVar131 [64];
  undefined8 uVar145;
  undefined1 auVar132 [64];
  undefined1 auVar133 [64];
  undefined1 auVar135 [64];
  undefined1 auVar136 [64];
  undefined1 extraout_var_00 [12];
  undefined1 auVar137 [64];
  undefined1 auVar139 [64];
  undefined1 auVar140 [64];
  undefined1 auVar141 [64];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar142 [64];
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 auVar143 [64];
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar185;
  float fVar188;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  float fVar187;
  float fVar190;
  float fVar195;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [32];
  undefined1 auVar192 [56];
  undefined1 auVar169 [64];
  undefined1 auVar170 [64];
  undefined1 auVar171 [64];
  undefined1 auVar172 [64];
  undefined8 uVar191;
  undefined1 auVar173 [64];
  float fVar193;
  undefined1 auVar174 [64];
  undefined1 auVar175 [64];
  float fVar186;
  float fVar189;
  float fVar194;
  undefined1 auVar177 [64];
  undefined1 auVar178 [64];
  undefined1 auVar179 [64];
  undefined1 auVar180 [64];
  undefined1 auVar182 [64];
  undefined1 auVar183 [64];
  undefined1 auVar184 [64];
  float fVar196;
  undefined1 auVar197 [16];
  float afVar198 [4];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  float fVar205;
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  float fVar214;
  undefined1 auVar216 [16];
  float fVar215;
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [64];
  float fVar221;
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  float fVar230;
  float fVar231;
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  float fVar249;
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [64];
  Float t0;
  undefined1 auVar258 [12];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 in_ZMM11 [64];
  undefined1 in_ZMM13 [64];
  Point3f p_00;
  Vector3f w;
  Vector3f woRender;
  SampledSpectrum SVar259;
  bool terminated;
  bool scattered;
  int voxel [3];
  Float nextCrossingT [3];
  Float uMode;
  int numScatters;
  int voxelLimit [3];
  int step [3];
  Float deltaT [3];
  RNG rng;
  SampledSpectrum beta;
  BSDF bsdf;
  optional<pbrt::ShapeIntersection> si;
  bool local_4f6;
  bool local_4f5;
  float local_4f4;
  undefined8 local_4f0;
  float local_4e4;
  Point3f local_4e0;
  uint local_4d0 [3];
  float local_4c4 [3];
  array<float,_4> local_4b8;
  undefined1 local_4a8 [16];
  uint *local_498;
  uint *local_490;
  float local_484;
  Ray local_480;
  undefined1 local_458 [8];
  float fStack_450;
  float fStack_44c;
  undefined1 local_448 [16];
  Float local_430;
  int local_42c;
  undefined1 local_428 [16];
  RayDifferential *local_410;
  undefined1 local_408 [16];
  SimpleVolPathIntegrator *local_3f8;
  uint local_3ec [4];
  uint local_3dc;
  uint local_3d8;
  float local_3d4 [3];
  RNG local_3c8;
  Interval *local_3b8;
  PrimitiveHandle *local_3b0;
  undefined1 local_3a8 [8];
  float fStack_3a0;
  float fStack_39c;
  SampledSpectrum local_398;
  undefined1 local_388 [8];
  float fStack_380;
  float fStack_37c;
  undefined1 local_378 [44];
  bool bStack_34c;
  SimpleVolPathIntegrator *local_348;
  RayDifferential *local_340;
  Interval *local_338;
  bool *local_330;
  RNG *local_328;
  undefined1 local_320 [20];
  float fStack_30c;
  Float FStack_308;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  local_300;
  undefined1 local_2f8 [32];
  undefined1 local_2d8 [8];
  float fStack_2d0;
  float fStack_2cc;
  undefined1 local_2c8 [8];
  undefined8 uStack_2c0;
  undefined1 local_2b8 [16];
  SampledSpectrum local_2a8;
  undefined1 local_290 [56];
  float local_258;
  MediumInterface *local_250;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  local_248;
  TaggedPointer<pbrt::HGPhaseFunction> local_240;
  SampledSpectrum local_238;
  SampledSpectrum local_228;
  undefined1 local_218 [32];
  SampledSpectrum local_1f8;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  ScratchBuffer *local_1c0;
  Interval local_1b8;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_1b0;
  aligned_storage_t<sizeof(pbrt::ShapeIntersection),_alignof(pbrt::ShapeIntersection)> local_1a8;
  undefined8 local_a8;
  float local_98 [4];
  undefined1 local_88 [16];
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined1 local_68 [32];
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  undefined1 auVar100 [16];
  undefined1 auVar134 [64];
  undefined1 auVar138 [64];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 auVar176 [64];
  undefined1 auVar181 [64];
  
  local_42c = 0;
  local_398.values.values[0] = 0.0;
  local_398.values.values[1] = 0.0;
  local_398.values.values[2] = 0.0;
  local_398.values.values[3] = 0.0;
  local_2a8.values.values[0] = 1.0;
  local_2a8.values.values[1] = 1.0;
  local_2a8.values.values[2] = 1.0;
  local_2a8.values.values[3] = 1.0;
  if ((((lambda->pdf).values[1] == 0.0) && (fVar107 = (lambda->pdf).values[2], fVar107 == 0.0)) &&
     (!NAN(fVar107))) {
    fVar107 = (lambda->pdf).values[3];
    if ((fVar107 == 0.0) && (!NAN(fVar107))) goto LAB_003e42f4;
  }
  (lambda->pdf).values[3] = 0.0;
  (lambda->pdf).values[1] = 0.0;
  (lambda->pdf).values[2] = 0.0;
  fVar107 = (lambda->pdf).values[0] * 0.25;
  (lambda->pdf).values[0] = fVar107;
LAB_003e42f4:
  local_68 = ZEXT432((uint)fVar107);
  local_3b0 = &(this->super_RayIntegrator).super_ImageTileIntegrator.super_Integrator.aggregate;
  local_410 = ray;
  local_3f8 = this;
  local_3b8 = (Interval *)sampler;
  local_1c0 = buf;
  do {
    pRVar74 = local_410;
    *(long *)(in_FS_OFFSET + -0x2b0) = *(long *)(in_FS_OFFSET + -0x2b0) + 1;
    if (((local_3b0->
         super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
         ).bits & 0xffffffffffff) == 0) {
      auVar255 = ZEXT1664((undefined1  [16])0x0);
      local_a8 = 0;
      local_1a8._192_64_ = vmovdqu64_avx512f(auVar255);
      local_1a8._128_64_ = vmovdqu64_avx512f(auVar255);
      local_1a8._64_64_ = vmovdqu64_avx512f(auVar255);
      local_1a8._0_64_ = vmovdqu64_avx512f(auVar255);
    }
    else {
      in_ZMM11 = ZEXT1664(in_ZMM11._0_16_);
      in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
      PrimitiveHandle::Intersect
                ((optional<pbrt::ShapeIntersection> *)&local_1a8.__align,local_3b0,
                 &local_410->super_Ray,INFINITY);
    }
    pIVar76 = local_3b8;
    local_4f5 = false;
    local_4f6 = false;
    if (((pRVar74->super_Ray).medium.
         super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
         .bits & 0xffffffffffff) == 0) {
LAB_003e7029:
      pRVar74 = local_410;
      bVar96 = false;
      if (local_4f5 == false) {
        if ((byte)local_a8 == '\x01') {
          uVar78._0_4_ = (local_410->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x;
          uVar78._4_4_ = (local_410->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
          auVar126._0_8_ = uVar78 ^ 0x8000000080000000;
          auVar126._8_4_ = 0x80000000;
          auVar126._12_4_ = 0x80000000;
          auVar167._0_4_ = -(local_410->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z;
          auVar167._4_4_ = 0x80000000;
          auVar167._8_4_ = 0x80000000;
          auVar167._12_4_ = 0x80000000;
          in_ZMM11 = ZEXT1664(in_ZMM11._0_16_);
          in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
          w.super_Tuple3<pbrt::Vector3,_float>.z = auVar167._0_4_;
          w.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)auVar126._0_8_;
          w.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)(auVar126._0_8_ >> 0x20);
          auVar146 = ZEXT856(auVar167._8_8_);
          auVar192 = ZEXT856(auVar126._8_8_);
          SVar259 = SurfaceInteraction::Le((SurfaceInteraction *)&local_1a8.__align,w,lambda);
          auVar181._0_8_ = SVar259.values.values._8_8_;
          auVar181._8_56_ = auVar146;
          auVar138._0_8_ = SVar259.values.values._0_8_;
          auVar138._8_56_ = auVar192;
          auVar116 = vmovlhps_avx(auVar138._0_16_,auVar181._0_16_);
          auVar127._0_4_ = auVar116._0_4_ * local_2a8.values.values[0];
          auVar127._4_4_ = auVar116._4_4_ * local_2a8.values.values[1];
          auVar127._8_4_ = auVar116._8_4_ * local_2a8.values.values[2];
          auVar127._12_4_ = auVar116._12_4_ * local_2a8.values.values[3];
          auVar116 = *(undefined1 (*) [16])(lambda->pdf).values;
          uVar78 = vcmpps_avx512vl(auVar116,_DAT_0054e010,4);
          auVar116 = vdivps_avx512vl(auVar127,auVar116);
          local_398.values.values[0] =
               (float)((uint)((byte)uVar78 & 1) * auVar116._0_4_) + local_398.values.values[0];
          local_398.values.values[1] =
               (float)((uint)((byte)(uVar78 >> 1) & 1) * auVar116._4_4_) +
               local_398.values.values[1];
          local_398.values.values[2] =
               (float)((uint)((byte)(uVar78 >> 2) & 1) * auVar116._8_4_) +
               local_398.values.values[2];
          local_398.values.values[3] =
               (float)((uint)((byte)(uVar78 >> 3) & 1) * auVar116._12_4_) +
               local_398.values.values[3];
          if ((byte)local_a8 == '\0') {
LAB_003e746f:
            LogFatal<char_const(&)[4]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                       ,0xea,"Check failed: %s",(char (*) [4])0x56907c);
          }
          local_1b0.bits =
               (local_3f8->super_RayIntegrator).super_ImageTileIntegrator.camera.
               super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
               .bits;
          local_1b8 = *local_3b8;
          SurfaceInteraction::GetBSDF
                    ((BSDF *)local_290,(SurfaceInteraction *)&local_1a8.__align,pRVar74,lambda,
                     (CameraHandle *)&local_1b0,local_1c0,(SamplerHandle *)&local_1b8);
          pIVar76 = local_3b8;
          if ((local_290._0_16_ & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0) {
            if ((byte)local_a8 != '\x01') goto LAB_003e746f;
            bVar96 = false;
            SurfaceInteraction::SkipIntersection
                      ((SurfaceInteraction *)&local_1a8.__align,local_410,(Float)local_1a8._248_4_);
          }
          else {
            local_378._0_8_ = *local_3b8;
            FVar106 = DispatchSplit<9>::operator()
                                ((DispatchSplit<9> *)&local_480,local_378,
                                 (ulong)local_378._0_8_ >> 0x30);
            local_2f8._0_4_ = FVar106;
            IVar8 = *pIVar76;
            uVar77 = (uint)IVar8.high._2_2_;
            if ((ulong)IVar8 >> 0x30 < 5) {
              if ((ulong)IVar8 < 0x3000000000000) {
                if (uVar77 == 2) {
                  u2 = (Tuple2<pbrt::Point2,_float>)
                       StratifiedSampler::Get2D
                                 ((StratifiedSampler *)((ulong)IVar8 & 0xffffffffffff));
                }
                else {
                  u2 = (Tuple2<pbrt::Point2,_float>)
                       RandomSampler::Get2D((RandomSampler *)((ulong)IVar8 & 0xffffffffffff));
                }
              }
              else {
                this_01 = (HaltonSampler *)((ulong)IVar8 & 0xffffffffffff);
                if ((uVar77 & 6) == 2) {
                  iVar97 = this_01->dimension;
                  if (0x3e6 < this_01->dimension) {
                    iVar97 = 2;
                  }
                  this_01->dimension = iVar97 + 2;
                  local_4a8._0_4_ = HaltonSampler::SampleDimension(this_01,iVar97);
                  local_4a8._4_4_ = extraout_XMM0_Db;
                  local_4a8._8_4_ = extraout_XMM0_Dc;
                  local_4a8._12_4_ = extraout_XMM0_Dd;
                  auVar142._0_4_ = HaltonSampler::SampleDimension(this_01,iVar97 + 1);
                  auVar142._4_60_ = extraout_var_01;
                  auVar116 = auVar142._0_16_;
LAB_003e7437:
                  auVar116 = vinsertps_avx(local_4a8,auVar116,0x10);
                  u2 = auVar116._0_8_;
                }
                else {
                  u2 = (Tuple2<pbrt::Point2,_float>)
                       PaddedSobolSampler::Get2D((PaddedSobolSampler *)this_01);
                }
              }
            }
            else {
              uVar85 = IVar8.high._2_2_ - 4;
              if (uVar85 < 3) {
                if (uVar85 == 2) {
                  u2 = (Tuple2<pbrt::Point2,_float>)
                       ZSobolSampler::Get2D((ZSobolSampler *)((ulong)IVar8 & 0xffffffffffff));
                }
                else {
                  u2 = (Tuple2<pbrt::Point2,_float>)
                       SobolSampler::Get2D((SobolSampler *)((ulong)IVar8 & 0xffffffffffff));
                }
              }
              else if (uVar77 - 6 < 2) {
                u2 = (Tuple2<pbrt::Point2,_float>)
                     PMJ02BNSampler::Get2D((PMJ02BNSampler *)((ulong)IVar8 & 0xffffffffffff));
              }
              else {
                this_02 = (DebugMLTSampler *)((ulong)IVar8 & 0xffffffffffff);
                if (uVar77 - 6 != 2) {
                  local_4a8._0_4_ = DebugMLTSampler::Get1D(this_02);
                  local_4a8._4_4_ = extraout_XMM0_Db_00;
                  local_4a8._8_4_ = extraout_XMM0_Dc_00;
                  local_4a8._12_4_ = extraout_XMM0_Dd_00;
                  auVar143._0_4_ = DebugMLTSampler::Get1D(this_02);
                  auVar143._4_60_ = extraout_var_02;
                  auVar116 = auVar143._0_16_;
                  goto LAB_003e7437;
                }
                u2 = (Tuple2<pbrt::Point2,_float>)MLTSampler::Get2D((MLTSampler *)this_02);
              }
            }
            uVar80._0_4_ = (local_410->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x;
            uVar80._4_4_ = (local_410->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
            woRender.super_Tuple3<pbrt::Vector3,_float>._0_8_ = uVar80 ^ 0x8000000080000000;
            woRender.super_Tuple3<pbrt::Vector3,_float>.z =
                 -(local_410->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z;
            BSDF::Sample_f((optional<pbrt::BSDFSample> *)local_378,(BSDF *)local_290,woRender,
                           (Float)local_2f8._0_4_,(Point2f)u2,Radiance,All);
            bVar96 = true;
            if (bStack_34c == true) {
              ErrorExit<>("SimpleVolPathIntegrator doesn\'t support surface scattering.");
            }
          }
        }
        else {
          bVar96 = true;
          pLVar95 = (local_3f8->super_RayIntegrator).super_ImageTileIntegrator.super_Integrator.
                    infiniteLights.
                    super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pLVar9 = *(pointer *)
                    ((long)&(local_3f8->super_RayIntegrator).super_ImageTileIntegrator.
                            super_Integrator.infiniteLights.
                            super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>
                            ._M_impl.super__Vector_impl_data + 8);
          while (pLVar95 != pLVar9) {
            uVar78 = (pLVar95->
                     super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
                     ).bits;
            auVar116 = ZEXT816(0) << 0x40;
            auVar102 = ZEXT816(0) << 0x40;
            uVar77 = (uint)(ushort)(uVar78 >> 0x30);
            if (6 < uVar77) {
              uVar77 = uVar77 - 6;
              this_03 = (ImageInfiniteLight *)(uVar78 & 0xffffffffffff);
              auVar116 = in_ZMM11._0_16_;
              auVar102 = in_ZMM13._0_16_;
              if (uVar77 < 2) {
                auVar192 = ZEXT856(0);
                auVar146 = ZEXT856(0);
                in_ZMM11 = ZEXT1664(auVar116);
                in_ZMM13 = ZEXT1664(auVar102);
                SVar259 = UniformInfiniteLight::Le
                                    ((UniformInfiniteLight *)this_03,&local_410->super_Ray,lambda);
                auVar182._0_8_ = SVar259.values.values._8_8_;
                auVar182._8_56_ = auVar146;
                auVar102 = auVar182._0_16_;
                auVar139._0_8_ = SVar259.values.values._0_8_;
                auVar139._8_56_ = auVar192;
                auVar116 = auVar139._0_16_;
              }
              else if (uVar77 == 2) {
                auVar192 = ZEXT856(0);
                auVar146 = ZEXT856(0);
                in_ZMM11 = ZEXT1664(auVar116);
                in_ZMM13 = ZEXT1664(auVar102);
                SVar259 = ImageInfiniteLight::Le(this_03,&local_410->super_Ray,lambda);
                auVar183._0_8_ = SVar259.values.values._8_8_;
                auVar183._8_56_ = auVar146;
                auVar102 = auVar183._0_16_;
                auVar140._0_8_ = SVar259.values.values._0_8_;
                auVar140._8_56_ = auVar192;
                auVar116 = auVar140._0_16_;
              }
              else {
                auVar192 = ZEXT856(0);
                auVar146 = ZEXT856(0);
                in_ZMM11 = ZEXT1664(auVar116);
                in_ZMM13 = ZEXT1664(auVar102);
                SVar259 = PortalImageInfiniteLight::Le
                                    ((PortalImageInfiniteLight *)this_03,&local_410->super_Ray,
                                     lambda);
                auVar184._0_8_ = SVar259.values.values._8_8_;
                auVar184._8_56_ = auVar146;
                auVar102 = auVar184._0_16_;
                auVar141._0_8_ = SVar259.values.values._0_8_;
                auVar141._8_56_ = auVar192;
                auVar116 = auVar141._0_16_;
              }
            }
            auVar116 = vmovlhps_avx(auVar116,auVar102);
            auVar128._0_4_ = auVar116._0_4_ * local_2a8.values.values[0];
            auVar128._4_4_ = auVar116._4_4_ * local_2a8.values.values[1];
            auVar128._8_4_ = auVar116._8_4_ * local_2a8.values.values[2];
            auVar128._12_4_ = auVar116._12_4_ * local_2a8.values.values[3];
            auVar116 = *(undefined1 (*) [16])(lambda->pdf).values;
            pLVar95 = pLVar95 + 1;
            uVar78 = vcmpps_avx512vl(auVar116,_DAT_0054e010,4);
            auVar116 = vdivps_avx512vl(auVar128,auVar116);
            local_398.values.values[0] =
                 (float)((uint)((byte)uVar78 & 1) * auVar116._0_4_) + local_398.values.values[0];
            local_398.values.values[1] =
                 (float)((uint)((byte)(uVar78 >> 1) & 1) * auVar116._4_4_) +
                 local_398.values.values[1];
            local_398.values.values[2] =
                 (float)((uint)((byte)(uVar78 >> 2) & 1) * auVar116._8_4_) +
                 local_398.values.values[2];
            local_398.values.values[3] =
                 (float)((uint)((byte)(uVar78 >> 3) & 1) * auVar116._12_4_) +
                 local_398.values.values[3];
          }
        }
      }
    }
    else {
      in_ZMM11 = ZEXT1664(in_ZMM11._0_16_);
      in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
      local_290._0_8_ = *local_3b8;
      FVar106 = DispatchSplit<9>::operator()
                          ((DispatchSplit<9> *)local_378,(MediumSample *)local_290,
                           (ulong)*local_3b8 >> 0x30);
      local_290._0_8_ = *pIVar76;
      local_2f8._0_4_ = FVar106;
      FVar106 = DispatchSplit<9>::operator()
                          ((DispatchSplit<9> *)local_378,(MediumSample *)local_290,
                           (ulong)local_290._0_8_ >> 0x30);
      uVar78 = (CONCAT44(extraout_var,local_2f8._0_4_) ^ 0x1a929e4d6f47a654) * -0x395b586ca42e166b;
      uVar80 = (uVar78 >> 0x2f ^ uVar78) * -0x395b586ca42e166b;
      uVar78 = uVar80 >> 0x2f ^ uVar80;
      uVar80 = (CONCAT44((int)(uVar80 >> 0x20),FVar106) ^ 0x1a929e4d6f47a654) * -0x395b586ca42e166b;
      uVar80 = (uVar80 >> 0x2f ^ uVar80) * -0x395b586ca42e166b;
      local_3c8.inc = uVar78 * 2 + 1;
      local_3c8.state =
           ((uVar80 >> 0x2f ^ uVar80) + 1) * 0x5851f42d4c957f2d + uVar78 * -0x4f5c17a566d501a4 + 1;
      local_290._0_8_ = *pIVar76;
      local_4a8 = ZEXT416((uint)((byte)local_a8 & 1) * local_1a8._248_4_ +
                          (uint)!(bool)((byte)local_a8 & 1) * 0x7f800000);
      local_2f8._0_4_ =
           DispatchSplit<9>::operator()
                     ((DispatchSplit<9> *)local_378,(MediumSample *)local_290,
                      (ulong)local_290._0_8_ >> 0x30);
      local_290._0_8_ = *pIVar76;
      local_430 = DispatchSplit<9>::operator()
                            ((DispatchSplit<9> *)local_378,(MediumSample *)local_290,
                             (ulong)*pIVar76 >> 0x30);
      uVar2 = (local_410->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.x;
      uVar4 = (local_410->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.y;
      auVar102._4_4_ = uVar4;
      auVar102._0_4_ = uVar2;
      auVar102._8_8_ = 0;
      fVar107 = (local_410->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z;
      auVar192 = (undefined1  [56])0x0;
      uVar3 = (local_410->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x;
      uVar5 = (local_410->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
      auVar100._4_4_ = uVar5;
      auVar100._0_4_ = uVar3;
      auVar100._8_8_ = 0;
      auVar116._8_8_ = 0;
      auVar116._0_8_ = *(ulong *)&(local_410->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z;
      TVar7.bits = (local_410->super_Ray).medium.
                   super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                   .bits;
      local_378._24_8_ = lambda;
      if (TVar7.bits < (float **)0x3000000000000) {
        if ((TVar7.bits & 0x3000000000000) == 0x2000000000000) {
          unique0x000f4700 = vmovlhps_avx(auVar100,auVar116);
          local_320._0_8_ = vmovlps_avx(auVar102);
          local_378._0_8_ = &local_430;
          local_378._8_8_ = &local_398;
          local_378._16_8_ = &local_2a8;
          local_378._32_8_ = &local_4f6;
          unique0x00005300 = &local_42c;
          local_330 = &local_4f5;
          local_328 = &local_3c8;
          local_348 = local_3f8;
          local_340 = local_410;
          local_338 = local_3b8;
          puVar83 = (undefined8 *)(TVar7.bits & 0xffffffffffff);
          local_4f4 = (float)local_4a8._0_4_;
          local_320._8_4_ = fVar107;
          local_300.bits = TVar7.bits;
          Transform::ApplyInverse
                    (&local_480,(Transform *)(puVar83 + 0xf),(Ray *)local_320,&local_4f4);
          auVar108._8_8_ = 0;
          auVar108._0_4_ = local_480.d.super_Tuple3<pbrt::Vector3,_float>.x;
          auVar108._4_4_ = local_480.d.super_Tuple3<pbrt::Vector3,_float>.y;
          auVar102 = ZEXT816(0) << 0x40;
          bVar96 = false;
          uVar77 = 0;
          auVar150._0_4_ =
               local_480.d.super_Tuple3<pbrt::Vector3,_float>.x *
               local_480.d.super_Tuple3<pbrt::Vector3,_float>.x;
          auVar150._4_4_ =
               local_480.d.super_Tuple3<pbrt::Vector3,_float>.y *
               local_480.d.super_Tuple3<pbrt::Vector3,_float>.y;
          auVar150._8_8_ = 0;
          auVar116 = vhaddps_avx(auVar150,auVar150);
          auVar116 = ZEXT416((uint)(auVar116._0_4_ +
                                   local_480.d.super_Tuple3<pbrt::Vector3,_float>.z *
                                   local_480.d.super_Tuple3<pbrt::Vector3,_float>.z));
          auVar116 = vsqrtss_avx(auVar116,auVar116);
          fVar107 = auVar116._0_4_;
          local_480.d.super_Tuple3<pbrt::Vector3,_float>.z =
               local_480.d.super_Tuple3<pbrt::Vector3,_float>.z / fVar107;
          local_4a8._0_4_ = fVar107 * local_4f4;
          local_4f4 = fVar107 * local_4f4;
          auVar206._4_4_ = fVar107;
          auVar206._0_4_ = fVar107;
          auVar206._8_4_ = fVar107;
          auVar206._12_4_ = fVar107;
          auVar116 = vdivps_avx(auVar108,auVar206);
          uVar78 = vmovlps_avx(auVar116);
          local_480.d.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar78;
          local_480.d.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)(uVar78 >> 0x20);
          auVar100 = vmovshdup_avx(auVar116);
          fVar196 = 1.0 / auVar116._0_4_;
          fVar214 = 1.0 / local_480.d.super_Tuple3<pbrt::Vector3,_float>.z;
          fVar107 = 1.0 / auVar100._0_4_;
          auVar192 = (undefined1  [56])0x0;
          do {
            pRVar89 = &local_480;
            auVar116 = ZEXT416((uint)(fVar196 *
                                     (*(float *)(puVar83 + 1) -
                                     local_480.o.super_Tuple3<pbrt::Point3,_float>.x)));
            pfVar88 = (float *)((long)puVar83 + 0x14);
            fVar205 = fVar196;
            if (uVar77 != 0) {
              pRVar89 = (Ray *)((long)&local_480.o.super_Tuple3<pbrt::Point3,_float> + 4);
              auVar116 = ZEXT416((uint)(fVar107 *
                                       (*(float *)((long)puVar83 + 0xc) -
                                       local_480.o.super_Tuple3<pbrt::Point3,_float>.y)));
              pfVar88 = (float *)(puVar83 + 3);
              fVar205 = fVar107;
              if (uVar77 != 1) {
                pRVar89 = (Ray *)((long)&local_480.o.super_Tuple3<pbrt::Point3,_float> + 8);
                auVar116 = ZEXT416((uint)(fVar214 *
                                         (*(float *)(puVar83 + 2) -
                                         local_480.o.super_Tuple3<pbrt::Point3,_float>.z)));
                pfVar88 = (float *)((long)puVar83 + 0x1c);
                fVar205 = fVar214;
              }
            }
            auVar111 = ZEXT416((uint)((*pfVar88 - (pRVar89->o).super_Tuple3<pbrt::Point3,_float>.x)
                                     * fVar205));
            auVar100 = vminss_avx(auVar111,auVar116);
            auVar116 = vmaxss_avx(auVar116,auVar111);
            auVar102 = vmaxss_avx(auVar100,auVar102);
            auVar116 = vminss_avx(ZEXT416((uint)(auVar116._0_4_ * 1.0000004)),
                                  ZEXT416((uint)local_4a8._0_4_));
            local_4a8._0_4_ = auVar116._0_4_;
            if (auVar116._0_4_ < auVar102._0_4_) {
              if (!bVar96) goto LAB_003e6ff6;
              break;
            }
            bVar96 = 1 < uVar77;
            uVar77 = uVar77 + 1;
          } while (uVar77 != 3);
          uVar144 = 0;
          _local_458 = ZEXT416(*(uint *)(puVar83 + 0xe));
          local_448 = auVar102;
          SVar259 = DenselySampledSpectrum::Sample((DenselySampledSpectrum *)(puVar83 + 4),lambda);
          auVar171._0_8_ = SVar259.values.values._8_8_;
          auVar171._8_56_ = auVar192;
          local_428._8_8_ = uVar144;
          local_428._0_8_ = SVar259.values.values._0_8_;
          local_4b8.values = auVar171._0_16_;
          auVar146 = (undefined1  [56])0x0;
          local_408 = ZEXT416(*(uint *)(puVar83 + 0xe));
          SVar259 = DenselySampledSpectrum::Sample((DenselySampledSpectrum *)(puVar83 + 9),lambda);
          auVar172._0_8_ = SVar259.values.values._8_8_;
          auVar172._8_56_ = auVar192;
          auVar131._0_8_ = SVar259.values.values._0_8_;
          auVar131._8_56_ = auVar146;
          auVar116 = vmovlhps_avx(auVar131._0_16_,auVar172._0_16_);
          auVar222._4_4_ = local_480.o.super_Tuple3<pbrt::Point3,_float>.y;
          auVar222._0_4_ = local_480.o.super_Tuple3<pbrt::Point3,_float>.x;
          auVar222._8_8_ = 0;
          auVar255 = ZEXT1664(local_448);
          auVar111 = ZEXT816(0) << 0x40;
          lVar90 = 0;
          auVar102 = vunpcklpd_avx(local_428,(undefined1  [16])local_4b8.values);
          local_490 = (uint *)(puVar83 + 0x23);
          local_2d8._0_4_ = (float)local_458._0_4_ * auVar102._0_4_;
          local_2d8._4_4_ = (float)local_458._0_4_ * auVar102._4_4_;
          fStack_2d0 = (float)local_458._0_4_ * auVar102._8_4_;
          fStack_2cc = (float)local_458._0_4_ * auVar102._12_4_;
          local_1d8 = (float)local_408._0_4_ * auVar116._0_4_;
          fStack_1d4 = (float)local_408._0_4_ * auVar116._4_4_;
          fStack_1d0 = (float)local_408._0_4_ * auVar116._8_4_;
          fStack_1cc = (float)local_408._0_4_ * auVar116._12_4_;
          local_1e8 = local_1d8 + (float)local_2d8._0_4_;
          fStack_1e4 = fStack_1d4 + (float)local_2d8._4_4_;
          fStack_1e0 = fStack_1d0 + fStack_2d0;
          fStack_1dc = fStack_1cc + fStack_2cc;
          fVar107 = *(float *)(puVar83 + 2);
          fVar205 = *(float *)((long)puVar83 + 0x1c) - fVar107;
          uVar144 = vcmpss_avx512f(ZEXT416((uint)fVar107),
                                   ZEXT416((uint)*(float *)((long)puVar83 + 0x1c)),1);
          bVar13 = (bool)((byte)uVar144 & 1);
          auVar153._8_8_ = 0;
          auVar153._0_8_ = *(ulong *)((long)puVar83 + 0x14);
          auVar112._8_8_ = 0;
          auVar112._0_8_ = puVar83[1];
          auVar116 = vsubps_avx(auVar153,auVar112);
          auVar102 = vsubps_avx(auVar222,auVar112);
          uVar78 = vcmpps_avx512vl(auVar112,auVar153,1);
          auVar113._8_8_ = 0;
          auVar113._0_4_ = local_480.d.super_Tuple3<pbrt::Vector3,_float>.x;
          auVar113._4_4_ = local_480.d.super_Tuple3<pbrt::Vector3,_float>.y;
          auVar100 = vdivps_avx512vl(auVar102,auVar116);
          bVar96 = (bool)((byte)uVar78 & 1);
          auVar101._0_4_ = (float)((uint)bVar96 * auVar100._0_4_ | (uint)!bVar96 * auVar102._0_4_);
          bVar96 = (bool)((byte)(uVar78 >> 1) & 1);
          auVar101._4_4_ = (uint)bVar96 * auVar100._4_4_ | (uint)!bVar96 * auVar102._4_4_;
          bVar96 = (bool)((byte)(uVar78 >> 2) & 1);
          auVar101._8_4_ = (uint)bVar96 * auVar100._8_4_ | (uint)!bVar96 * auVar102._8_4_;
          bVar96 = (bool)((byte)(uVar78 >> 3) & 1);
          auVar101._12_4_ = (uint)bVar96 * auVar100._12_4_ | (uint)!bVar96 * auVar102._12_4_;
          auVar116 = vdivps_avx(auVar113,auVar116);
          auVar102 = vmovshdup_avx(auVar101);
          local_4e4 = local_480.d.super_Tuple3<pbrt::Vector3,_float>.z / fVar205;
          local_4f0 = vmovlps_avx(auVar116);
          fVar249 = local_448._0_4_;
          auVar100 = vmovshdup_avx(auVar116);
          fVar196 = fVar249 * auVar116._0_4_ + auVar101._0_4_;
          fVar214 = fVar249 * auVar100._0_4_ + auVar102._0_4_;
          uVar77 = *(uint *)((long)puVar83 + 0x11c);
          uVar85 = *(uint *)(puVar83 + 0x23);
          uVar78 = CONCAT44(0,uVar85);
          fVar107 = (float)((uint)bVar13 *
                            (int)((local_480.o.super_Tuple3<pbrt::Point3,_float>.z - fVar107) /
                                 fVar205) +
                           (uint)!bVar13 *
                           (int)(local_480.o.super_Tuple3<pbrt::Point3,_float>.z - fVar107)) +
                    fVar249 * local_4e4;
          fVar205 = (float)(int)uVar77;
          auVar258 = in_ZMM11._4_12_;
          local_458 = (undefined1  [8])uVar78;
          auVar223._0_4_ = (float)(int)(uVar77 - 1);
          auVar223._4_12_ = auVar258;
          local_498 = (uint *)((long)puVar83 + 0x11c);
          auVar232._0_4_ = (float)(int)(uVar85 - 1);
          auVar232._4_12_ = auVar258;
          auVar116 = vminss_avx(auVar223,ZEXT416((uint)(fVar214 * fVar205)));
          uVar144 = vcmpss_avx512f(ZEXT416((uint)(fVar214 * fVar205)),auVar111,1);
          fVar215 = (float)(int)uVar85;
          uVar94 = (uint)(float)((uint)!(bool)((byte)uVar144 & 1) * auVar116._0_4_);
          auVar116 = vminss_avx(auVar232,ZEXT416((uint)(fVar196 * fVar215)));
          uVar144 = vcmpss_avx512f(ZEXT416((uint)(fVar196 * fVar215)),auVar111,1);
          fVar221 = (float)*(int *)(puVar83 + 0x24);
          auVar239._0_4_ = (float)(*(int *)(puVar83 + 0x24) + -1);
          auVar239._4_12_ = auVar258;
          uVar85 = (uint)(float)((uint)!(bool)((byte)uVar144 & 1) * auVar116._0_4_);
          auVar116 = vminss_avx(auVar239,ZEXT416((uint)(fVar107 * fVar221)));
          uVar144 = vcmpss_avx512f(ZEXT416((uint)(fVar107 * fVar221)),auVar111,1);
          uVar86 = (uint)(float)((uint)!(bool)((byte)uVar144 & 1) * auVar116._0_4_);
          do {
            iVar97 = (int)lVar90;
            if (iVar97 == 1) {
              local_4d0[1] = uVar94;
              puVar91 = local_3ec + 1;
              puVar92 = local_3ec + 4;
              pfVar84 = local_3d4 + 1;
              pfVar88 = local_4c4 + 1;
              pfVar81 = (float *)((long)&local_4f0 + 4);
              uVar87 = uVar94;
            }
            else if (iVar97 == 0) {
              local_4d0[lVar90] = uVar85;
              puVar91 = local_3ec;
              puVar92 = local_3ec + 3;
              pfVar84 = local_3d4;
              pfVar88 = local_4c4;
              pfVar81 = (float *)&local_4f0;
              uVar87 = uVar85;
            }
            else {
              puVar91 = local_3ec + 2;
              puVar92 = local_3ec + 5;
              pfVar84 = local_3d4 + 2;
              pfVar88 = local_4c4 + 2;
              pfVar81 = &local_4e4;
              local_4d0[lVar90] = uVar86;
              uVar87 = uVar86;
            }
            if ((*pfVar81 == 0.0) && (!NAN(*pfVar81))) {
              pfVar81 = (float *)&local_4f0;
              if ((iVar97 != 0) && (pfVar81 = (float *)((long)&local_4f0 + 4), iVar97 != 1)) {
                pfVar81 = &local_4e4;
              }
              *pfVar81 = 0.0;
            }
            pfVar81 = (float *)&local_4f0;
            if ((iVar97 != 0) && (pfVar81 = (float *)((long)&local_4f0 + 4), iVar97 != 1)) {
              pfVar81 = &local_4e4;
            }
            if (0.0 <= *pfVar81) {
              fVar230 = (float)(int)(uVar87 + 1);
              if (iVar97 == 1) {
                *pfVar88 = fVar249 + (fVar230 / fVar205 - fVar214) / local_4f0._4_4_;
                fVar230 = local_4f0._4_4_ * fVar205;
                puVar82 = local_498;
              }
              else if (iVar97 == 0) {
                *pfVar88 = fVar249 + (fVar230 / fVar215 - fVar196) / (float)local_4f0;
                fVar230 = (float)local_4f0 * fVar215;
                puVar82 = local_490;
              }
              else {
                *pfVar88 = fVar249 + (fVar230 / fVar221 - fVar107) / local_4e4;
                fVar230 = local_4e4 * fVar221;
                puVar82 = (uint *)(puVar83 + 0x24);
              }
              *puVar92 = 1;
              *pfVar84 = 1.0 / fVar230;
              uVar87 = *puVar82;
            }
            else {
              fVar230 = (float)(int)uVar87;
              if (iVar97 == 1) {
                fVar230 = fVar230 / fVar205 - fVar214;
                puVar82 = local_498;
                fVar231 = local_4f0._4_4_;
              }
              else if (iVar97 == 0) {
                fVar230 = fVar230 / fVar215 - fVar196;
                puVar82 = local_490;
                fVar231 = (float)local_4f0;
              }
              else {
                fVar230 = fVar230 / fVar221 - fVar107;
                puVar82 = (uint *)(puVar83 + 0x24);
                fVar231 = local_4e4;
              }
              *pfVar88 = fVar249 + fVar230 / fVar231;
              uVar93 = *puVar82;
              uVar87 = 0xffffffff;
              *puVar92 = 0xffffffff;
              *pfVar84 = -1.0 / (fVar231 * (float)(int)uVar93);
            }
            lVar90 = lVar90 + 1;
            *puVar91 = uVar87;
          } while (lVar90 != 3);
          auVar220 = ZEXT464((uint)local_2f8._0_4_);
          local_4b8.values[2] = 1.0;
          local_4b8.values[0] = 1.0;
          local_4b8.values[1] = 1.0;
          local_4b8.values[3] = 1.0;
          while( true ) {
            auVar71._4_4_ = fStack_1e4;
            auVar71._0_4_ = local_1e8;
            auVar71._8_4_ = fStack_1e0;
            auVar71._12_4_ = fStack_1dc;
            lVar90 = (long)*(int *)(&DAT_0056d940 +
                                   (ulong)((uint)(local_4c4[1] < local_4c4[2]) |
                                          (uint)(local_4c4[0] < local_4c4[1]) * 4 +
                                          (uint)(local_4c4[0] < local_4c4[2]) * 2) * 4);
            fVar107 = local_4c4[lVar90];
            uVar1 = *(undefined4 *)
                     (puVar83[0x20] +
                     ((long)(int)((uVar77 * local_4d0[2] + local_4d0[1]) * (int)uVar78) +
                     (long)(int)local_4d0[0]) * 4);
            auVar14._4_4_ = uVar1;
            auVar14._0_4_ = uVar1;
            auVar14._8_4_ = uVar1;
            auVar14._12_4_ = uVar1;
            auVar102 = vmulps_avx512vl(auVar71,auVar14);
            auVar116 = vminss_avx(ZEXT416((uint)fVar107),ZEXT416((uint)local_4a8._0_4_));
            auVar15._8_4_ = 0x80000000;
            auVar15._0_8_ = 0x8000000080000000;
            auVar15._12_4_ = 0x80000000;
            auVar100 = vxorps_avx512vl(auVar102,auVar15);
            local_428._0_4_ = auVar116._0_4_;
            if ((auVar102._0_4_ != 0.0) || (NAN(auVar102._0_4_))) {
              while( true ) {
                _local_3a8 = auVar100;
                _local_458 = auVar102;
                local_484 = fVar107;
                local_448._0_4_ = auVar255._0_4_;
                fVar107 = logf(1.0 - auVar220._0_4_);
                uVar75 = local_3c8.state;
                uVar78 = local_3c8.state >> 0x1b;
                local_3c8.state = local_3c8.state * 0x5851f42d4c957f2d + local_3c8.inc;
                uVar77 = (uint)(uVar75 >> 0x2d) ^ (uint)uVar78;
                bVar79 = (byte)(uVar75 >> 0x3b);
                fVar196 = (float)local_448._0_4_ - fVar107 / (float)local_458._0_4_;
                auVar255 = ZEXT464((uint)fVar196);
                auVar116 = vcvtusi2ss_avx512f(in_ZMM13._0_16_,
                                              uVar77 >> bVar79 | uVar77 << 0x20 - bVar79);
                auVar116 = vminss_avx(ZEXT416((uint)(auVar116._0_4_ * 2.3283064e-10)),
                                      ZEXT416(0x3f7fffff));
                auVar220 = ZEXT1664(auVar116);
                fVar107 = local_484;
                if ((float)local_428._0_4_ <= fVar196) break;
                auVar102 = _local_458;
                auVar100 = _local_3a8;
                if (fVar196 < (float)local_4a8._0_4_) {
                  fVar107 = fVar196 - (float)local_448._0_4_;
                  local_2f8._0_4_ = auVar116._0_4_;
                  local_448 = ZEXT416((uint)fVar196);
                  auVar115._0_4_ = fVar107 * (float)local_3a8._0_4_;
                  auVar115._4_4_ = fVar107 * (float)local_3a8._4_4_;
                  auVar115._8_4_ = fVar107 * fStack_3a0;
                  auVar115._12_4_ = fVar107 * fStack_39c;
                  auVar23._8_4_ = 0x3fb8aa3b;
                  auVar23._0_8_ = 0x3fb8aa3b3fb8aa3b;
                  auVar23._12_4_ = 0x3fb8aa3b;
                  auVar116 = vmulps_avx512vl(auVar115,auVar23);
                  _local_388 = vroundps_avx(auVar116,9);
                  auVar116 = vsubps_avx(auVar116,_local_388);
                  auVar154._8_4_ = 0x3da00ac9;
                  auVar154._0_8_ = 0x3da00ac93da00ac9;
                  auVar154._12_4_ = 0x3da00ac9;
                  auVar24._8_4_ = 0x3e679a0b;
                  auVar24._0_8_ = 0x3e679a0b3e679a0b;
                  auVar24._12_4_ = 0x3e679a0b;
                  auVar102 = vfmadd213ps_avx512vl(auVar154,auVar116,auVar24);
                  auVar25._8_4_ = 0x3f321004;
                  auVar25._0_8_ = 0x3f3210043f321004;
                  auVar25._12_4_ = 0x3f321004;
                  auVar102 = vfmadd213ps_avx512vl(auVar102,auVar116,auVar25);
                  auVar26._8_4_ = 0x3f800000;
                  auVar26._0_8_ = 0x3f8000003f800000;
                  auVar26._12_4_ = 0x3f800000;
                  local_408 = vfmadd213ps_avx512vl(auVar102,auVar116,auVar26);
                  local_4e0.super_Tuple3<pbrt::Point3,_float>.z =
                       fVar196 * local_480.d.super_Tuple3<pbrt::Vector3,_float>.z +
                       local_480.o.super_Tuple3<pbrt::Point3,_float>.z;
                  uVar145 = 0;
                  auVar155._0_4_ =
                       fVar196 * local_480.d.super_Tuple3<pbrt::Vector3,_float>.x +
                       local_480.o.super_Tuple3<pbrt::Point3,_float>.x;
                  auVar155._4_4_ =
                       fVar196 * local_480.d.super_Tuple3<pbrt::Vector3,_float>.y +
                       local_480.o.super_Tuple3<pbrt::Point3,_float>.y;
                  auVar155._8_4_ = fVar196 * 0.0 + 0.0;
                  auVar155._12_4_ = fVar196 * 0.0 + 0.0;
                  uVar191 = auVar155._8_8_;
                  uVar144 = vmovlps_avx(auVar155);
                  local_4e0.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar144;
                  local_4e0.super_Tuple3<pbrt::Point3,_float>.y = (float)((ulong)uVar144 >> 0x20);
                  SVar259 = UniformGridMediumProvider::Density
                                      ((UniformGridMediumProvider *)*puVar83,&local_4e0,lambda);
                  local_2b8._8_8_ = uVar145;
                  local_2b8._0_8_ = SVar259.values.values._0_8_;
                  uStack_2c0 = uVar191;
                  local_2c8 = (undefined1  [8])SVar259.values.values._8_8_;
                  p.super_Tuple3<pbrt::Point3,_float>.y =
                       local_4e0.super_Tuple3<pbrt::Point3,_float>.y;
                  p.super_Tuple3<pbrt::Point3,_float>.x =
                       local_4e0.super_Tuple3<pbrt::Point3,_float>.x;
                  p.super_Tuple3<pbrt::Point3,_float>.z =
                       local_4e0.super_Tuple3<pbrt::Point3,_float>.z;
                  auVar146 = SUB6456(ZEXT6064((undefined1  [60])0x0),4);
                  auVar192 = ZEXT856(0);
                  SVar259 = UniformGridMediumProvider::Le
                                      ((UniformGridMediumProvider *)*puVar83,p,lambda);
                  auVar173._0_8_ = SVar259.values.values._8_8_;
                  auVar173._8_56_ = auVar146;
                  auVar132._0_8_ = SVar259.values.values._0_8_;
                  auVar132._8_56_ = auVar192;
                  auVar200._0_4_ = (int)(float)local_388._0_4_;
                  auVar200._4_4_ = (int)(float)local_388._4_4_;
                  auVar200._8_4_ = (int)fStack_380;
                  auVar200._12_4_ = (int)fStack_37c;
                  auVar217._8_4_ = 0xffffff81;
                  auVar217._0_8_ = 0xffffff81ffffff81;
                  auVar217._12_4_ = 0xffffff81;
                  auVar102 = vpsrld_avx(local_408,0x17);
                  auVar116 = vpaddd_avx(auVar200,auVar217);
                  auVar116 = vpaddd_avx(auVar116,auVar102);
                  auVar27._8_4_ = 0x807fffff;
                  auVar27._0_8_ = 0x807fffff807fffff;
                  auVar27._12_4_ = 0x807fffff;
                  auVar103 = vpandd_avx512vl(local_408,auVar27);
                  auVar28._8_4_ = 0x7f;
                  auVar28._0_8_ = 0x7f0000007f;
                  auVar28._12_4_ = 0x7f;
                  uVar78 = vpcmpgtd_avx512vl(auVar116,auVar28);
                  uVar78 = uVar78 & 0xf;
                  auVar102 = vfmadd231ss_fma(ZEXT416((uint)(local_4e0.
                                                            super_Tuple3<pbrt::Point3,_float>.y *
                                                           *(float *)((long)puVar83 + 0x7c))),
                                             ZEXT416((uint)local_4e0.
                                                           super_Tuple3<pbrt::Point3,_float>.x),
                                             ZEXT416(*(uint *)(puVar83 + 0xf)));
                  auVar100 = vfmadd231ss_fma(ZEXT416((uint)(local_4e0.
                                                            super_Tuple3<pbrt::Point3,_float>.y *
                                                           *(float *)((long)puVar83 + 0xac))),
                                             ZEXT416((uint)local_4e0.
                                                           super_Tuple3<pbrt::Point3,_float>.x),
                                             ZEXT416(*(uint *)(puVar83 + 0x15)));
                  auVar111 = vfmadd231ss_fma(ZEXT416((uint)(local_4e0.
                                                            super_Tuple3<pbrt::Point3,_float>.y *
                                                           *(float *)((long)puVar83 + 0x8c))),
                                             ZEXT416((uint)local_4e0.
                                                           super_Tuple3<pbrt::Point3,_float>.x),
                                             ZEXT416(*(uint *)(puVar83 + 0x11)));
                  auVar152 = vfmadd231ss_fma(ZEXT416((uint)(local_4e0.
                                                            super_Tuple3<pbrt::Point3,_float>.y *
                                                           *(float *)((long)puVar83 + 0x9c))),
                                             ZEXT416((uint)local_4e0.
                                                           super_Tuple3<pbrt::Point3,_float>.x),
                                             ZEXT416(*(uint *)(puVar83 + 0x13)));
                  uVar80 = vpcmpgtd_avx512vl(auVar116,auVar217);
                  uVar80 = uVar80 & 0xf;
                  auVar116 = vpslld_avx(auVar116,0x17);
                  auVar29._8_4_ = 0x3f800000;
                  auVar29._0_8_ = 0x3f8000003f800000;
                  auVar29._12_4_ = 0x3f800000;
                  auVar104 = vpaddd_avx512vl(auVar116,auVar29);
                  auVar116 = vfmadd231ss_fma(auVar102,ZEXT416((uint)local_4e0.
                                                                                                                                        
                                                  super_Tuple3<pbrt::Point3,_float>.z),
                                             ZEXT416(*(uint *)(puVar83 + 0x10)));
                  auVar102 = vfmadd231ss_fma(auVar100,ZEXT416((uint)local_4e0.
                                                                                                                                        
                                                  super_Tuple3<pbrt::Point3,_float>.z),
                                             ZEXT416(*(uint *)(puVar83 + 0x16)));
                  auVar100 = vfmadd231ss_fma(auVar111,ZEXT416((uint)local_4e0.
                                                                                                                                        
                                                  super_Tuple3<pbrt::Point3,_float>.z),
                                             ZEXT416(*(uint *)(puVar83 + 0x12)));
                  auVar111 = vfmadd231ss_fma(auVar152,ZEXT416((uint)local_4e0.
                                                                                                                                        
                                                  super_Tuple3<pbrt::Point3,_float>.z),
                                             ZEXT416(*(uint *)(puVar83 + 0x14)));
                  fVar107 = auVar102._0_4_ + *(float *)((long)puVar83 + 0xb4);
                  fVar196 = auVar116._0_4_ + *(float *)((long)puVar83 + 0x84);
                  fVar214 = auVar100._0_4_ + *(float *)((long)puVar83 + 0x94);
                  fVar205 = auVar111._0_4_ + *(float *)((long)puVar83 + 0xa4);
                  auVar116 = vpord_avx512vl(auVar104,auVar103);
                  auVar100 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                  bVar96 = (bool)((byte)uVar78 & 1);
                  bVar13 = (bool)((byte)(uVar78 >> 1) & 1);
                  bVar10 = (bool)((byte)(uVar78 >> 2) & 1);
                  bVar11 = SUB81(uVar78 >> 3,0);
                  auVar102 = vunpcklpd_avx(local_2b8,_local_2c8);
                  local_238.values.values[0] = auVar102._0_4_ * (float)local_2d8._0_4_;
                  local_238.values.values[1] = auVar102._4_4_ * (float)local_2d8._4_4_;
                  local_238.values.values[2] = auVar102._8_4_ * fStack_2d0;
                  local_238.values.values[3] = auVar102._12_4_ * fStack_2cc;
                  bVar12 = fVar107 == 1.0;
                  local_1f8.values.values[0] =
                       (float)((uint)bVar96 * auVar100._0_4_ |
                              (uint)!bVar96 * (uint)((byte)uVar80 & 1) * auVar116._0_4_) *
                       local_4b8.values[0];
                  local_1f8.values.values[1] =
                       (float)((uint)bVar13 * auVar100._4_4_ |
                              (uint)!bVar13 * (uint)((byte)(uVar80 >> 1) & 1) * auVar116._4_4_) *
                       local_4b8.values[1];
                  local_1f8.values.values[2] =
                       (float)((uint)bVar10 * auVar100._8_4_ |
                              (uint)!bVar10 * (uint)((byte)(uVar80 >> 2) & 1) * auVar116._8_4_) *
                       local_4b8.values[2];
                  local_1f8.values.values[3] =
                       (float)((uint)bVar11 * auVar100._12_4_ |
                              (uint)!bVar11 * (uint)(byte)(uVar80 >> 3) * auVar116._12_4_) *
                       local_4b8.values[3];
                  iVar97 = (uint)bVar12 * (int)fVar196 + (uint)!bVar12 * (int)(fVar196 / fVar107);
                  iVar98 = (uint)bVar12 * (int)fVar205 + (uint)!bVar12 * (int)(fVar205 / fVar107);
                  iVar99 = (uint)bVar12 * (int)fVar214 + (uint)!bVar12 * (int)(fVar214 / fVar107);
                  auVar233._4_4_ = iVar97;
                  auVar233._0_4_ = iVar97;
                  auVar233._8_4_ = iVar97;
                  auVar233._12_4_ = iVar97;
                  auVar240._4_4_ = iVar99;
                  auVar240._0_4_ = iVar99;
                  auVar240._8_4_ = iVar99;
                  auVar240._12_4_ = iVar99;
                  auVar224._4_4_ = iVar98;
                  auVar224._0_4_ = iVar98;
                  auVar224._8_4_ = iVar98;
                  auVar224._12_4_ = iVar98;
                  local_290._0_16_ = vmovlhps_avx(auVar233,auVar240);
                  local_290._40_16_ = ZEXT416(0) << 0x20;
                  auVar250._0_4_ = local_320._12_4_ * local_320._12_4_;
                  auVar250._4_4_ = local_320._16_4_ * local_320._16_4_;
                  auVar250._8_8_ = 0;
                  auVar245._0_8_ = local_320._12_8_ ^ 0x8000000080000000;
                  auVar245._8_4_ = 0x80000000;
                  auVar245._12_4_ = 0x80000000;
                  auVar116 = vhaddps_avx(auVar250,auVar250);
                  auVar116 = ZEXT416((uint)(auVar116._0_4_ + fStack_30c * fStack_30c));
                  auVar116 = vsqrtss_avx(auVar116,auVar116);
                  local_218._16_16_ = vmovlhps_avx(auVar132._0_16_,auVar173._0_16_);
                  local_290._36_4_ = auVar116._0_4_;
                  auVar256._4_4_ = local_290._36_4_;
                  auVar256._0_4_ = local_290._36_4_;
                  auVar256._8_4_ = local_290._36_4_;
                  auVar256._12_4_ = local_290._36_4_;
                  local_290._36_4_ = -fStack_30c / (float)local_290._36_4_;
                  auVar116 = vdivps_avx(auVar245,auVar256);
                  in_ZMM11 = ZEXT1664(_local_458);
                  local_258 = 0.0;
                  local_290._16_8_ = vmovlps_avx(auVar224);
                  local_290._24_4_ = FStack_308;
                  local_290._28_8_ = vmovlps_avx(auVar116);
                  local_250 = (MediumInterface *)0x0;
                  local_228.values.values[1] = auVar102._4_4_ * fStack_1d4;
                  local_228.values.values[0] = auVar102._0_4_ * local_1d8;
                  local_228.values.values[2] = auVar102._8_4_ * fStack_1d0;
                  local_228.values.values[3] = auVar102._12_4_ * fStack_1cc;
                  local_218._0_16_ = _local_458;
                  local_248.bits = TVar7.bits;
                  local_240.bits = (long)puVar83 + 0x74U | 0x1000000000000;
                  bVar96 = Li::anon_class_88_11_08f5f5b0::operator()
                                     ((anon_class_88_11_08f5f5b0 *)local_378,
                                      (MediumSample *)local_290);
                  auVar220 = ZEXT464((uint)local_2f8._0_4_);
                  auVar255 = ZEXT1664(local_448);
                  local_4b8.values[2] = 1.0;
                  local_4b8.values[0] = 1.0;
                  local_4b8.values[1] = 1.0;
                  local_4b8.values[3] = 1.0;
                  fVar107 = local_484;
                  auVar102 = _local_458;
                  auVar100 = _local_3a8;
                  if (!bVar96) goto LAB_003e6ff6;
                }
              }
              fVar196 = (float)local_428._0_4_ - (float)local_448._0_4_;
              auVar114._0_4_ = fVar196 * (float)local_3a8._0_4_;
              auVar114._4_4_ = fVar196 * (float)local_3a8._4_4_;
              auVar114._8_4_ = fVar196 * fStack_3a0;
              auVar114._12_4_ = fVar196 * fStack_39c;
            }
            else {
              fVar196 = auVar116._0_4_ - auVar255._0_4_;
              auVar114._0_4_ = fVar196 * auVar100._0_4_;
              auVar114._4_4_ = fVar196 * auVar100._4_4_;
              auVar114._8_4_ = fVar196 * auVar100._8_4_;
              auVar114._12_4_ = fVar196 * auVar100._12_4_;
            }
            auVar208._8_4_ = 0xffffff81;
            auVar208._0_8_ = 0xffffff81ffffff81;
            auVar199._8_4_ = 0x3da00ac9;
            auVar199._0_8_ = 0x3da00ac93da00ac9;
            auVar208._12_4_ = 0xffffff81;
            auVar199._12_4_ = 0x3da00ac9;
            auVar16._8_4_ = 0x3fb8aa3b;
            auVar16._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar16._12_4_ = 0x3fb8aa3b;
            auVar102 = vmulps_avx512vl(auVar114,auVar16);
            auVar116 = vroundps_avx(auVar102,9);
            auVar102 = vsubps_avx(auVar102,auVar116);
            auVar17._8_4_ = 0x3e679a0b;
            auVar17._0_8_ = 0x3e679a0b3e679a0b;
            auVar17._12_4_ = 0x3e679a0b;
            auVar100 = vfmadd213ps_avx512vl(auVar199,auVar102,auVar17);
            auVar156._0_4_ = (int)auVar116._0_4_;
            auVar156._4_4_ = (int)auVar116._4_4_;
            auVar156._8_4_ = (int)auVar116._8_4_;
            auVar156._12_4_ = (int)auVar116._12_4_;
            auVar116 = vpaddd_avx(auVar156,auVar208);
            auVar18._8_4_ = 0x3f321004;
            auVar18._0_8_ = 0x3f3210043f321004;
            auVar18._12_4_ = 0x3f321004;
            auVar100 = vfmadd213ps_avx512vl(auVar100,auVar102,auVar18);
            auVar19._8_4_ = 0x3f800000;
            auVar19._0_8_ = 0x3f8000003f800000;
            auVar19._12_4_ = 0x3f800000;
            auVar102 = vfmadd213ps_avx512vl(auVar100,auVar102,auVar19);
            auVar100 = vpsrld_avx(auVar102,0x17);
            auVar116 = vpaddd_avx(auVar116,auVar100);
            auVar20._8_4_ = 0x7f;
            auVar20._0_8_ = 0x7f0000007f;
            auVar20._12_4_ = 0x7f;
            uVar78 = vpcmpgtd_avx512vl(auVar116,auVar20);
            uVar78 = uVar78 & 0xf;
            auVar21._8_4_ = 0x807fffff;
            auVar21._0_8_ = 0x807fffff807fffff;
            auVar21._12_4_ = 0x807fffff;
            auVar102 = vpandd_avx512vl(auVar102,auVar21);
            uVar80 = vpcmpgtd_avx512vl(auVar116,auVar208);
            uVar80 = uVar80 & 0xf;
            auVar116 = vpslld_avx(auVar116,0x17);
            auVar22._8_4_ = 0x3f800000;
            auVar22._0_8_ = 0x3f8000003f800000;
            auVar22._12_4_ = 0x3f800000;
            auVar116 = vpaddd_avx512vl(auVar116,auVar22);
            auVar116 = vpord_avx512vl(auVar116,auVar102);
            auVar102 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            bVar96 = (bool)((byte)uVar78 & 1);
            bVar13 = (bool)((byte)(uVar78 >> 1) & 1);
            bVar10 = (bool)((byte)(uVar78 >> 2) & 1);
            bVar11 = SUB81(uVar78 >> 3,0);
            fVar147 = (float)((uint)bVar96 * auVar102._0_4_ |
                             (uint)!bVar96 * (uint)((byte)uVar80 & 1) * auVar116._0_4_) *
                      local_4b8.values[0];
            fVar185 = (float)((uint)bVar13 * auVar102._4_4_ |
                             (uint)!bVar13 * (uint)((byte)(uVar80 >> 1) & 1) * auVar116._4_4_) *
                      local_4b8.values[1];
            fVar188 = (float)((uint)bVar10 * auVar102._8_4_ |
                             (uint)!bVar10 * (uint)((byte)(uVar80 >> 2) & 1) * auVar116._8_4_) *
                      local_4b8.values[2];
            fVar193 = (float)((uint)bVar11 * auVar102._12_4_ |
                             (uint)!bVar11 * (uint)(byte)(uVar80 >> 3) * auVar116._12_4_) *
                      local_4b8.values[3];
            local_4b8.values[0] = fVar147;
            local_4b8.values[1] = fVar185;
            local_4b8.values[2] = fVar188;
            local_4b8.values[3] = fVar193;
            if (((float)local_4a8._0_4_ < fVar107) ||
               (uVar77 = local_4d0[lVar90], uVar85 = local_3ec[lVar90 + 3],
               local_4d0[lVar90] = uVar77 + uVar85, puVar92 = local_490, puVar91 = local_498,
               uVar77 + uVar85 == local_3ec[lVar90])) break;
            auVar255 = ZEXT464((uint)local_428._0_4_);
            local_4c4[lVar90] = fVar107 + local_3d4[lVar90];
            uVar78 = (ulong)*puVar92;
            uVar77 = *puVar91;
          }
        }
        else {
          local_378._0_8_ = &local_430;
          local_378._8_8_ = &local_398;
          local_2b8._0_4_ = fVar107;
          local_378._16_8_ = &local_2a8;
          local_378._32_8_ = &local_4f6;
          this_00 = (DenselySampledSpectrum *)(TVar7.bits & 0xffffffffffff);
          local_330 = &local_4f5;
          unique0x00005300 = &local_42c;
          local_348 = local_3f8;
          local_340 = local_410;
          local_328 = &local_3c8;
          local_338 = local_3b8;
          uVar144 = 0;
          local_428 = ZEXT416((uint)this_00[3].lambda_min);
          _local_458 = auVar100;
          local_448 = auVar116;
          _local_2c8 = auVar102;
          SVar259 = DenselySampledSpectrum::Sample(this_00,lambda);
          auVar169._0_8_ = SVar259.values.values._8_8_;
          auVar169._8_56_ = auVar192;
          local_4b8.values[2] = (float)(int)uVar144;
          local_4b8.values[3] = (float)(int)((ulong)uVar144 >> 0x20);
          local_4b8.values[0] = (float)(int)SVar259.values.values._0_8_;
          local_4b8.values[1] = (float)(int)((ulong)SVar259.values.values._0_8_ >> 0x20);
          local_408 = auVar169._0_16_;
          auVar146 = (undefined1  [56])0x0;
          _local_388 = ZEXT416((uint)this_00[3].lambda_min);
          SVar259 = DenselySampledSpectrum::Sample(this_00 + 1,lambda);
          auVar170._0_8_ = SVar259.values.values._8_8_;
          auVar170._8_56_ = auVar192;
          auVar130._0_8_ = SVar259.values.values._0_8_;
          auVar130._8_56_ = auVar146;
          auVar116 = vunpcklpd_avx((undefined1  [16])local_4b8.values,local_408);
          auVar216._0_4_ = (float)local_428._0_4_ * auVar116._0_4_;
          auVar216._4_4_ = (float)local_428._0_4_ * auVar116._4_4_;
          auVar216._8_4_ = (float)local_428._0_4_ * auVar116._8_4_;
          auVar216._12_4_ = (float)local_428._0_4_ * auVar116._12_4_;
          auVar197._0_4_ = (float)local_458._0_4_ * (float)local_458._0_4_;
          auVar197._4_4_ = (float)local_458._4_4_ * (float)local_458._4_4_;
          auVar197._8_4_ = fStack_450 * fStack_450;
          auVar197._12_4_ = fStack_44c * fStack_44c;
          auVar116 = vhaddps_avx(auVar197,auVar197);
          auVar116 = ZEXT416((uint)((float)local_448._0_4_ * (float)local_448._0_4_ + auVar116._0_4_
                                   ));
          auVar102 = vsqrtss_avx(auVar116,auVar116);
          auVar116 = vmovlhps_avx(auVar130._0_16_,auVar170._0_16_);
          fVar107 = auVar102._0_4_ * (float)local_4a8._0_4_;
          afVar198[0] = (float)local_388._0_4_ * auVar116._0_4_;
          afVar198[1] = (float)local_388._0_4_ * auVar116._4_4_;
          afVar198[2] = (float)local_388._0_4_ * auVar116._8_4_;
          afVar198[3] = (float)local_388._0_4_ * auVar116._12_4_;
          fVar196 = afVar198[0] + auVar216._0_4_;
          bVar96 = ABS(fVar107) == INFINITY;
          uVar77 = (uint)bVar96 * 0x7f7fffff + (uint)!bVar96 * (int)fVar107;
          if ((fVar196 != 0.0) || (NAN(fVar196))) {
            local_4a8 = ZEXT416(uVar77);
            fVar107 = 1.0 - (float)local_2f8._0_4_;
            local_2f8 = ZEXT1632(CONCAT412(afVar198[3] + auVar216._12_4_,
                                           CONCAT48(afVar198[2] + auVar216._8_4_,
                                                    CONCAT44(afVar198[1] + auVar216._4_4_,fVar196)))
                                );
            in_ZMM11 = ZEXT1664(in_ZMM11._0_16_);
            in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
            local_4b8.values = afVar198;
            local_428 = auVar216;
            local_408 = auVar102;
            fVar107 = logf(fVar107);
            fVar196 = local_2f8._0_4_;
            fVar107 = -fVar107 / fVar196;
            fVar214 = local_4a8._0_4_;
            if (fVar214 <= fVar107) {
              local_78 = fVar196 * -fVar214;
              fStack_74 = local_2f8._4_4_ * -fVar214;
              fStack_70 = local_2f8._8_4_ * -fVar214;
              fStack_6c = local_2f8._12_4_ * -fVar214;
            }
            else {
              local_4a8._0_8_ = CONCAT44(extraout_var_00._0_4_,fVar107) ^ 0x8000000000000000;
              local_4a8._8_4_ = extraout_var_00._4_4_ ^ 0x80000000;
              local_4a8._12_4_ = extraout_var_00._8_4_ ^ 0x80000000;
              local_88._0_4_ = fVar196 * -fVar107;
              local_88._4_4_ = local_2f8._4_4_ * -fVar107;
              local_88._8_4_ = local_2f8._8_4_ * -fVar107;
              local_88._12_4_ = local_2f8._12_4_ * -fVar107;
              auVar31._8_4_ = 0x3fb8aa3b;
              auVar31._0_8_ = 0x3fb8aa3b3fb8aa3b;
              auVar31._12_4_ = 0x3fb8aa3b;
              auVar116 = vmulps_avx512vl(local_88,auVar31);
              _local_2d8 = vroundps_avx(auVar116,9);
              auVar116 = vsubps_avx(auVar116,_local_2d8);
              auVar164._8_4_ = 0x3da00ac9;
              auVar164._0_8_ = 0x3da00ac93da00ac9;
              auVar164._12_4_ = 0x3da00ac9;
              auVar32._8_4_ = 0x3e679a0b;
              auVar32._0_8_ = 0x3e679a0b3e679a0b;
              auVar32._12_4_ = 0x3e679a0b;
              auVar102 = vfmadd213ps_avx512vl(auVar164,auVar116,auVar32);
              auVar33._8_4_ = 0x3f321004;
              auVar33._0_8_ = 0x3f3210043f321004;
              auVar33._12_4_ = 0x3f321004;
              auVar102 = vfmadd213ps_avx512vl(auVar102,auVar116,auVar33);
              auVar34._8_4_ = 0x3f800000;
              auVar34._0_8_ = 0x3f8000003f800000;
              auVar34._12_4_ = 0x3f800000;
              _local_3a8 = vfmadd213ps_avx512vl(auVar102,auVar116,auVar34);
              _local_388 = ZEXT416((uint)this_00[3].lambda_max);
              auVar192 = ZEXT856(0);
              auVar146 = ZEXT856(local_3a8._8_8_);
              SVar259 = DenselySampledSpectrum::Sample(this_00 + 2,lambda);
              auVar180._0_8_ = SVar259.values.values._8_8_;
              auVar180._8_56_ = auVar146;
              auVar137._0_8_ = SVar259.values.values._0_8_;
              auVar137._8_56_ = auVar192;
              auVar238._0_4_ = (int)(float)local_2d8._0_4_;
              auVar238._4_4_ = (int)(float)local_2d8._4_4_;
              auVar238._8_4_ = (int)fStack_2d0;
              auVar238._12_4_ = (int)fStack_2cc;
              auVar248._8_4_ = 0xffffff81;
              auVar248._0_8_ = 0xffffff81ffffff81;
              auVar248._12_4_ = 0xffffff81;
              auVar102 = vmovlhps_avx(auVar137._0_16_,auVar180._0_16_);
              local_248.bits = (uintptr_t)&this_00[0x66666666666].values.ptr;
              local_240.bits = (ulong)&this_00[3].values | 0x1000000000000;
              auVar103 = vpsrld_avx(_local_3a8,0x17);
              auVar212._4_4_ = local_408._0_4_;
              auVar212._0_4_ = local_408._0_4_;
              auVar212._8_4_ = local_408._0_4_;
              auVar212._12_4_ = local_408._0_4_;
              auVar111 = vshufpd_avx(local_428,local_428,1);
              local_228.values.values = (array<float,_4>)(array<float,_4>)local_4b8.values;
              local_258 = 0.0;
              auVar100 = vpaddd_avx(auVar248,auVar238);
              auVar116 = vdivps_avx(_local_458,auVar212);
              local_290._36_4_ = local_448._0_4_ / (float)local_408._0_4_;
              auVar104 = local_2f8._0_16_;
              auVar152 = vshufpd_avx(auVar104,auVar104,1);
              auVar100 = vpaddd_avx(auVar100,auVar103);
              auVar35._8_4_ = 0x807fffff;
              auVar35._0_8_ = 0x807fffff807fffff;
              auVar35._12_4_ = 0x807fffff;
              auVar103 = vpandd_avx512vl(_local_3a8,auVar35);
              auVar36._8_4_ = 0x7f;
              auVar36._0_8_ = 0x7f0000007f;
              auVar36._12_4_ = 0x7f;
              uVar78 = vpcmpgtd_avx512vl(auVar100,auVar36);
              uVar78 = uVar78 & 0xf;
              auVar254._0_4_ = (float)local_388._0_4_ * auVar102._0_4_;
              auVar254._4_4_ = (float)local_388._0_4_ * auVar102._4_4_;
              auVar254._8_4_ = (float)local_388._0_4_ * auVar102._8_4_;
              auVar254._12_4_ = (float)local_388._0_4_ * auVar102._12_4_;
              uVar80 = vpcmpgtd_avx512vl(auVar100,auVar248);
              uVar80 = uVar80 & 0xf;
              auVar102 = vpslld_avx(auVar100,0x17);
              auVar37._8_4_ = 0x3f800000;
              auVar37._0_8_ = 0x3f8000003f800000;
              auVar37._12_4_ = 0x3f800000;
              auVar102 = vpaddd_avx512vl(auVar102,auVar37);
              local_68 = ZEXT1632(auVar254);
              auVar100 = vpord_avx512vl(auVar102,auVar103);
              auVar102 = vmovshdup_avx(auVar116);
              auVar103 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              bVar96 = (bool)((byte)uVar78 & 1);
              local_1f8.values.values[0] =
                   (float)((uint)bVar96 * auVar103._0_4_ |
                          (uint)!bVar96 * (uint)((byte)uVar80 & 1) * auVar100._0_4_);
              bVar96 = (bool)((byte)(uVar78 >> 1) & 1);
              local_1f8.values.values[1] =
                   (float)((uint)bVar96 * auVar103._4_4_ |
                          (uint)!bVar96 * (uint)((byte)(uVar80 >> 1) & 1) * auVar100._4_4_);
              bVar96 = (bool)((byte)(uVar78 >> 2) & 1);
              local_1f8.values.values[2] =
                   (float)((uint)bVar96 * auVar103._8_4_ |
                          (uint)!bVar96 * (uint)((byte)(uVar80 >> 2) & 1) * auVar100._8_4_);
              bVar96 = SUB81(uVar78 >> 3,0);
              local_1f8.values.values[3] =
                   (float)((uint)bVar96 * auVar103._12_4_ |
                          (uint)!bVar96 * (uint)(byte)(uVar80 >> 3) * auVar100._12_4_);
              fVar107 = (float)local_290._36_4_ * (float)local_4a8._0_4_ + (float)local_2b8._0_4_;
              auVar213._0_8_ = auVar116._0_8_ ^ 0x8000000080000000;
              auVar213._8_4_ = auVar116._8_4_ ^ 0x80000000;
              auVar213._12_4_ = auVar116._12_4_ ^ 0x80000000;
              local_290._36_4_ = -(float)local_290._36_4_;
              fVar196 = local_2c8._0_4_ + auVar116._0_4_ * (float)local_4a8._0_4_;
              auVar116 = vmovshdup_avx(_local_2c8);
              fVar214 = auVar116._0_4_ + auVar102._0_4_ * (float)local_4a8._0_4_;
              auVar125._4_4_ = fVar196;
              auVar125._0_4_ = fVar196;
              auVar125._8_4_ = fVar196;
              auVar125._12_4_ = fVar196;
              auVar165._4_4_ = fVar214;
              auVar165._0_4_ = fVar214;
              auVar165._8_4_ = fVar214;
              auVar165._12_4_ = fVar214;
              local_290._0_16_ = vmovlhps_avx(auVar125,auVar165);
              auVar166._4_4_ = fVar107;
              auVar166._0_4_ = fVar107;
              auVar166._8_4_ = fVar107;
              auVar166._12_4_ = fVar107;
              local_290._40_12_ = ZEXT812(0);
              local_290._52_4_ = 0;
              local_238.values.values = (array<float,_4>)vunpcklpd_avx(local_428,auVar111);
              local_290._16_8_ = vmovlps_avx(auVar166);
              local_290._24_4_ = vextractps_avx(local_448,1);
              local_290._28_8_ = vmovlps_avx(auVar213);
              local_250 = (MediumInterface *)0x0;
              auVar129._16_16_ = auVar254;
              auVar129._0_16_ = auVar104;
              auVar168._16_16_ = auVar152;
              auVar168._0_16_ = auVar104;
              auVar168 = vperm2f128_avx(auVar168,local_68,0x21);
              local_218 = vshufpd_avx(auVar129,auVar168,8);
              in_ZMM11 = ZEXT1664(auVar104);
              in_ZMM13 = ZEXT1664((undefined1  [16])local_4b8.values);
              local_98 = (float  [4])local_1f8.values.values;
              Li::anon_class_88_11_08f5f5b0::operator()
                        ((anon_class_88_11_08f5f5b0 *)local_378,(MediumSample *)local_290);
            }
          }
          else {
            auVar110._4_4_ = uVar77;
            auVar110._0_4_ = uVar77;
            auVar110._8_4_ = uVar77;
            auVar110._12_4_ = uVar77;
            auVar30._8_4_ = 0x80000000;
            auVar30._0_8_ = 0x8000000080000000;
            auVar30._12_4_ = 0x80000000;
            auVar116 = vxorps_avx512vl(auVar110,auVar30);
            local_48 = fVar196 * auVar116._0_4_;
            fStack_44 = (afVar198[1] + auVar216._4_4_) * auVar116._4_4_;
            fStack_40 = (afVar198[2] + auVar216._8_4_) * auVar116._8_4_;
            fStack_3c = (afVar198[3] + auVar216._12_4_) * auVar116._12_4_;
          }
        }
      }
      else {
        unique0x000f4700 = vmovlhps_avx(auVar100,auVar116);
        if ((TVar7.bits & 0xfffe000000000000) == 0x2000000000000) {
          local_320._0_8_ = vmovlps_avx(auVar102);
          local_378._0_8_ = &local_430;
          local_378._8_8_ = &local_398;
          local_378._16_8_ = &local_2a8;
          local_378._32_8_ = &local_4f6;
          unique0x00005300 = &local_42c;
          local_330 = &local_4f5;
          local_328 = &local_3c8;
          local_348 = local_3f8;
          local_340 = local_410;
          local_338 = local_3b8;
          puVar83 = (undefined8 *)(TVar7.bits & 0xffffffffffff);
          local_4f0._0_4_ = (float)local_4a8._0_4_;
          local_320._8_4_ = fVar107;
          local_300.bits = TVar7.bits;
          Transform::ApplyInverse
                    (&local_480,(Transform *)(puVar83 + 0xf),(Ray *)local_320,(Float *)&local_4f0);
          auVar109._8_8_ = 0;
          auVar109._0_4_ = local_480.d.super_Tuple3<pbrt::Vector3,_float>.x;
          auVar109._4_4_ = local_480.d.super_Tuple3<pbrt::Vector3,_float>.y;
          auVar102 = ZEXT816(0) << 0x40;
          bVar96 = false;
          uVar77 = 0;
          auVar151._0_4_ =
               local_480.d.super_Tuple3<pbrt::Vector3,_float>.x *
               local_480.d.super_Tuple3<pbrt::Vector3,_float>.x;
          auVar151._4_4_ =
               local_480.d.super_Tuple3<pbrt::Vector3,_float>.y *
               local_480.d.super_Tuple3<pbrt::Vector3,_float>.y;
          auVar151._8_8_ = 0;
          auVar116 = vhaddps_avx(auVar151,auVar151);
          auVar116 = ZEXT416((uint)(auVar116._0_4_ +
                                   local_480.d.super_Tuple3<pbrt::Vector3,_float>.z *
                                   local_480.d.super_Tuple3<pbrt::Vector3,_float>.z));
          auVar116 = vsqrtss_avx(auVar116,auVar116);
          fVar107 = auVar116._0_4_;
          local_480.d.super_Tuple3<pbrt::Vector3,_float>.z =
               local_480.d.super_Tuple3<pbrt::Vector3,_float>.z / fVar107;
          local_4a8._0_4_ = fVar107 * (float)local_4f0;
          local_4f0 = CONCAT44(local_4f0._4_4_,fVar107 * (float)local_4f0);
          auVar207._4_4_ = fVar107;
          auVar207._0_4_ = fVar107;
          auVar207._8_4_ = fVar107;
          auVar207._12_4_ = fVar107;
          auVar116 = vdivps_avx(auVar109,auVar207);
          uVar78 = vmovlps_avx(auVar116);
          local_480.d.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar78;
          local_480.d.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)(uVar78 >> 0x20);
          auVar100 = vmovshdup_avx(auVar116);
          fVar196 = 1.0 / auVar116._0_4_;
          fVar214 = 1.0 / local_480.d.super_Tuple3<pbrt::Vector3,_float>.z;
          fVar107 = 1.0 / auVar100._0_4_;
          auVar192 = (undefined1  [56])0x0;
          do {
            pRVar89 = &local_480;
            auVar116 = ZEXT416((uint)(fVar196 *
                                     (*(float *)(puVar83 + 1) -
                                     local_480.o.super_Tuple3<pbrt::Point3,_float>.x)));
            pfVar88 = (float *)((long)puVar83 + 0x14);
            fVar205 = fVar196;
            if (uVar77 != 0) {
              pRVar89 = (Ray *)((long)&local_480.o.super_Tuple3<pbrt::Point3,_float> + 4);
              auVar116 = ZEXT416((uint)(fVar107 *
                                       (*(float *)((long)puVar83 + 0xc) -
                                       local_480.o.super_Tuple3<pbrt::Point3,_float>.y)));
              pfVar88 = (float *)(puVar83 + 3);
              fVar205 = fVar107;
              if (uVar77 != 1) {
                pRVar89 = (Ray *)((long)&local_480.o.super_Tuple3<pbrt::Point3,_float> + 8);
                auVar116 = ZEXT416((uint)(fVar214 *
                                         (*(float *)(puVar83 + 2) -
                                         local_480.o.super_Tuple3<pbrt::Point3,_float>.z)));
                pfVar88 = (float *)((long)puVar83 + 0x1c);
                fVar205 = fVar214;
              }
            }
            auVar111 = ZEXT416((uint)((*pfVar88 - (pRVar89->o).super_Tuple3<pbrt::Point3,_float>.x)
                                     * fVar205));
            auVar100 = vminss_avx(auVar111,auVar116);
            auVar116 = vmaxss_avx(auVar116,auVar111);
            auVar102 = vmaxss_avx(auVar100,auVar102);
            auVar116 = vminss_avx(ZEXT416((uint)(auVar116._0_4_ * 1.0000004)),
                                  ZEXT416((uint)local_4a8._0_4_));
            local_4a8._0_4_ = auVar116._0_4_;
            if (auVar116._0_4_ < auVar102._0_4_) {
              if (!bVar96) goto LAB_003e6ff6;
              break;
            }
            bVar96 = 1 < uVar77;
            uVar77 = uVar77 + 1;
          } while (uVar77 != 3);
          uVar144 = 0;
          _local_458 = ZEXT416(*(uint *)(puVar83 + 0xe));
          local_448 = auVar102;
          SVar259 = DenselySampledSpectrum::Sample((DenselySampledSpectrum *)(puVar83 + 4),lambda);
          auVar174._0_8_ = SVar259.values.values._8_8_;
          auVar174._8_56_ = auVar192;
          local_428._8_8_ = uVar144;
          local_428._0_8_ = SVar259.values.values._0_8_;
          local_4b8.values = auVar174._0_16_;
          auVar146 = (undefined1  [56])0x0;
          local_408 = ZEXT416(*(uint *)(puVar83 + 0xe));
          SVar259 = DenselySampledSpectrum::Sample((DenselySampledSpectrum *)(puVar83 + 9),lambda);
          auVar175._0_8_ = SVar259.values.values._8_8_;
          auVar175._8_56_ = auVar192;
          auVar133._0_8_ = SVar259.values.values._0_8_;
          auVar133._8_56_ = auVar146;
          auVar116 = vmovlhps_avx(auVar133._0_16_,auVar175._0_16_);
          auVar225._4_4_ = local_480.o.super_Tuple3<pbrt::Point3,_float>.y;
          auVar225._0_4_ = local_480.o.super_Tuple3<pbrt::Point3,_float>.x;
          auVar225._8_8_ = 0;
          auVar255 = ZEXT1664(local_448);
          auVar111 = ZEXT816(0) << 0x40;
          lVar90 = 0;
          auVar102 = vunpcklpd_avx(local_428,(undefined1  [16])local_4b8.values);
          local_490 = (uint *)(puVar83 + 0x23);
          local_2d8._0_4_ = (float)local_458._0_4_ * auVar102._0_4_;
          local_2d8._4_4_ = (float)local_458._0_4_ * auVar102._4_4_;
          fStack_2d0 = (float)local_458._0_4_ * auVar102._8_4_;
          fStack_2cc = (float)local_458._0_4_ * auVar102._12_4_;
          local_1d8 = (float)local_408._0_4_ * auVar116._0_4_;
          fStack_1d4 = (float)local_408._0_4_ * auVar116._4_4_;
          fStack_1d0 = (float)local_408._0_4_ * auVar116._8_4_;
          fStack_1cc = (float)local_408._0_4_ * auVar116._12_4_;
          local_1e8 = local_1d8 + (float)local_2d8._0_4_;
          fStack_1e4 = fStack_1d4 + (float)local_2d8._4_4_;
          fStack_1e0 = fStack_1d0 + fStack_2d0;
          fStack_1dc = fStack_1cc + fStack_2cc;
          fVar107 = *(float *)(puVar83 + 2);
          fVar205 = *(float *)((long)puVar83 + 0x1c) - fVar107;
          uVar144 = vcmpss_avx512f(ZEXT416((uint)fVar107),
                                   ZEXT416((uint)*(float *)((long)puVar83 + 0x1c)),1);
          bVar13 = (bool)((byte)uVar144 & 1);
          auVar157._8_8_ = 0;
          auVar157._0_8_ = *(ulong *)((long)puVar83 + 0x14);
          auVar117._8_8_ = 0;
          auVar117._0_8_ = puVar83[1];
          auVar116 = vsubps_avx(auVar157,auVar117);
          auVar102 = vsubps_avx(auVar225,auVar117);
          uVar78 = vcmpps_avx512vl(auVar117,auVar157,1);
          auVar118._8_8_ = 0;
          auVar118._0_4_ = local_480.d.super_Tuple3<pbrt::Vector3,_float>.x;
          auVar118._4_4_ = local_480.d.super_Tuple3<pbrt::Vector3,_float>.y;
          auVar100 = vdivps_avx512vl(auVar102,auVar116);
          bVar96 = (bool)((byte)uVar78 & 1);
          auVar105._0_4_ = (float)((uint)bVar96 * auVar100._0_4_ | (uint)!bVar96 * auVar102._0_4_);
          bVar96 = (bool)((byte)(uVar78 >> 1) & 1);
          auVar105._4_4_ = (uint)bVar96 * auVar100._4_4_ | (uint)!bVar96 * auVar102._4_4_;
          bVar96 = (bool)((byte)(uVar78 >> 2) & 1);
          auVar105._8_4_ = (uint)bVar96 * auVar100._8_4_ | (uint)!bVar96 * auVar102._8_4_;
          bVar96 = (bool)((byte)(uVar78 >> 3) & 1);
          auVar105._12_4_ = (uint)bVar96 * auVar100._12_4_ | (uint)!bVar96 * auVar102._12_4_;
          auVar116 = vdivps_avx(auVar118,auVar116);
          auVar102 = vmovshdup_avx(auVar105);
          local_4f4 = local_480.d.super_Tuple3<pbrt::Vector3,_float>.z / fVar205;
          uVar144 = vmovlps_avx(auVar116);
          local_4e0.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar144;
          local_4e0.super_Tuple3<pbrt::Point3,_float>.y = (float)((ulong)uVar144 >> 0x20);
          fVar249 = local_448._0_4_;
          auVar100 = vmovshdup_avx(auVar116);
          fVar196 = fVar249 * auVar116._0_4_ + auVar105._0_4_;
          fVar214 = fVar249 * auVar100._0_4_ + auVar102._0_4_;
          uVar77 = *(uint *)((long)puVar83 + 0x11c);
          uVar85 = *(uint *)(puVar83 + 0x23);
          uVar78 = CONCAT44(0,uVar85);
          fVar107 = (float)((uint)bVar13 *
                            (int)((local_480.o.super_Tuple3<pbrt::Point3,_float>.z - fVar107) /
                                 fVar205) +
                           (uint)!bVar13 *
                           (int)(local_480.o.super_Tuple3<pbrt::Point3,_float>.z - fVar107)) +
                    fVar249 * local_4f4;
          fVar205 = (float)(int)uVar77;
          auVar258 = in_ZMM11._4_12_;
          local_458 = (undefined1  [8])uVar78;
          auVar226._0_4_ = (float)(int)(uVar77 - 1);
          auVar226._4_12_ = auVar258;
          local_498 = (uint *)((long)puVar83 + 0x11c);
          auVar234._0_4_ = (float)(int)(uVar85 - 1);
          auVar234._4_12_ = auVar258;
          auVar116 = vminss_avx(auVar226,ZEXT416((uint)(fVar214 * fVar205)));
          uVar144 = vcmpss_avx512f(ZEXT416((uint)(fVar214 * fVar205)),auVar111,1);
          fVar215 = (float)(int)uVar85;
          uVar94 = (uint)(float)((uint)!(bool)((byte)uVar144 & 1) * auVar116._0_4_);
          auVar116 = vminss_avx(auVar234,ZEXT416((uint)(fVar196 * fVar215)));
          uVar144 = vcmpss_avx512f(ZEXT416((uint)(fVar196 * fVar215)),auVar111,1);
          fVar221 = (float)*(int *)(puVar83 + 0x24);
          auVar241._0_4_ = (float)(*(int *)(puVar83 + 0x24) + -1);
          auVar241._4_12_ = auVar258;
          uVar85 = (uint)(float)((uint)!(bool)((byte)uVar144 & 1) * auVar116._0_4_);
          auVar116 = vminss_avx(auVar241,ZEXT416((uint)(fVar107 * fVar221)));
          uVar144 = vcmpss_avx512f(ZEXT416((uint)(fVar107 * fVar221)),auVar111,1);
          uVar86 = (uint)(float)((uint)!(bool)((byte)uVar144 & 1) * auVar116._0_4_);
          do {
            iVar97 = (int)lVar90;
            if (iVar97 == 1) {
              local_4d0[1] = uVar94;
              puVar91 = local_3ec + 1;
              puVar92 = local_3ec + 4;
              pfVar84 = local_3d4 + 1;
              pfVar88 = local_4c4 + 1;
              pfVar81 = &local_4e0.super_Tuple3<pbrt::Point3,_float>.y;
              uVar87 = uVar94;
            }
            else if (iVar97 == 0) {
              local_4d0[lVar90] = uVar85;
              puVar91 = local_3ec;
              puVar92 = local_3ec + 3;
              pfVar84 = local_3d4;
              pfVar88 = local_4c4;
              pfVar81 = (float *)&local_4e0;
              uVar87 = uVar85;
            }
            else {
              puVar91 = local_3ec + 2;
              puVar92 = local_3ec + 5;
              pfVar84 = local_3d4 + 2;
              pfVar88 = local_4c4 + 2;
              pfVar81 = &local_4f4;
              local_4d0[lVar90] = uVar86;
              uVar87 = uVar86;
            }
            if ((*pfVar81 == 0.0) && (!NAN(*pfVar81))) {
              pfVar81 = (float *)&local_4e0;
              if ((iVar97 != 0) &&
                 (pfVar81 = &local_4e0.super_Tuple3<pbrt::Point3,_float>.y, iVar97 != 1)) {
                pfVar81 = &local_4f4;
              }
              *pfVar81 = 0.0;
            }
            pfVar81 = (float *)&local_4e0;
            if ((iVar97 != 0) &&
               (pfVar81 = &local_4e0.super_Tuple3<pbrt::Point3,_float>.y, iVar97 != 1)) {
              pfVar81 = &local_4f4;
            }
            if (0.0 <= *pfVar81) {
              fVar230 = (float)(int)(uVar87 + 1);
              if (iVar97 == 1) {
                *pfVar88 = fVar249 + (fVar230 / fVar205 - fVar214) /
                                     local_4e0.super_Tuple3<pbrt::Point3,_float>.y;
                fVar230 = local_4e0.super_Tuple3<pbrt::Point3,_float>.y * fVar205;
                puVar82 = local_498;
              }
              else if (iVar97 == 0) {
                *pfVar88 = fVar249 + (fVar230 / fVar215 - fVar196) /
                                     local_4e0.super_Tuple3<pbrt::Point3,_float>.x;
                fVar230 = local_4e0.super_Tuple3<pbrt::Point3,_float>.x * fVar215;
                puVar82 = local_490;
              }
              else {
                *pfVar88 = fVar249 + (fVar230 / fVar221 - fVar107) / local_4f4;
                fVar230 = local_4f4 * fVar221;
                puVar82 = (uint *)(puVar83 + 0x24);
              }
              *puVar92 = 1;
              *pfVar84 = 1.0 / fVar230;
              uVar87 = *puVar82;
            }
            else {
              fVar230 = (float)(int)uVar87;
              if (iVar97 == 1) {
                fVar230 = fVar230 / fVar205 - fVar214;
                puVar82 = local_498;
                fVar231 = local_4e0.super_Tuple3<pbrt::Point3,_float>.y;
              }
              else if (iVar97 == 0) {
                fVar230 = fVar230 / fVar215 - fVar196;
                puVar82 = local_490;
                fVar231 = local_4e0.super_Tuple3<pbrt::Point3,_float>.x;
              }
              else {
                fVar230 = fVar230 / fVar221 - fVar107;
                puVar82 = (uint *)(puVar83 + 0x24);
                fVar231 = local_4f4;
              }
              *pfVar88 = fVar249 + fVar230 / fVar231;
              uVar93 = *puVar82;
              uVar87 = 0xffffffff;
              *puVar92 = 0xffffffff;
              *pfVar84 = -1.0 / (fVar231 * (float)(int)uVar93);
            }
            lVar90 = lVar90 + 1;
            *puVar91 = uVar87;
          } while (lVar90 != 3);
          auVar220 = ZEXT464((uint)local_2f8._0_4_);
          local_4b8.values[2] = 1.0;
          local_4b8.values[0] = 1.0;
          local_4b8.values[1] = 1.0;
          local_4b8.values[3] = 1.0;
          while( true ) {
            auVar72._4_4_ = fStack_1e4;
            auVar72._0_4_ = local_1e8;
            auVar72._8_4_ = fStack_1e0;
            auVar72._12_4_ = fStack_1dc;
            lVar90 = (long)*(int *)(&DAT_0056d940 +
                                   (ulong)((uint)(local_4c4[1] < local_4c4[2]) |
                                          (uint)(local_4c4[0] < local_4c4[1]) * 4 +
                                          (uint)(local_4c4[0] < local_4c4[2]) * 2) * 4);
            fVar107 = local_4c4[lVar90];
            uVar1 = *(undefined4 *)
                     (puVar83[0x20] +
                     ((long)(int)((uVar77 * local_4d0[2] + local_4d0[1]) * (int)uVar78) +
                     (long)(int)local_4d0[0]) * 4);
            auVar38._4_4_ = uVar1;
            auVar38._0_4_ = uVar1;
            auVar38._8_4_ = uVar1;
            auVar38._12_4_ = uVar1;
            auVar102 = vmulps_avx512vl(auVar72,auVar38);
            auVar116 = vminss_avx(ZEXT416((uint)fVar107),ZEXT416((uint)local_4a8._0_4_));
            auVar39._8_4_ = 0x80000000;
            auVar39._0_8_ = 0x8000000080000000;
            auVar39._12_4_ = 0x80000000;
            auVar100 = vxorps_avx512vl(auVar102,auVar39);
            local_428._0_4_ = auVar116._0_4_;
            if ((auVar102._0_4_ != 0.0) || (NAN(auVar102._0_4_))) {
              while( true ) {
                _local_3a8 = auVar100;
                _local_458 = auVar102;
                local_484 = fVar107;
                local_448._0_4_ = auVar255._0_4_;
                fVar107 = logf(1.0 - auVar220._0_4_);
                uVar75 = local_3c8.state;
                uVar78 = local_3c8.state >> 0x1b;
                local_3c8.state = local_3c8.state * 0x5851f42d4c957f2d + local_3c8.inc;
                uVar77 = (uint)(uVar75 >> 0x2d) ^ (uint)uVar78;
                bVar79 = (byte)(uVar75 >> 0x3b);
                fVar196 = (float)local_448._0_4_ - fVar107 / (float)local_458._0_4_;
                auVar255 = ZEXT464((uint)fVar196);
                auVar116 = vcvtusi2ss_avx512f(in_ZMM11._0_16_,
                                              uVar77 >> bVar79 | uVar77 << 0x20 - bVar79);
                auVar116 = vminss_avx(ZEXT416((uint)(auVar116._0_4_ * 2.3283064e-10)),
                                      ZEXT416(0x3f7fffff));
                auVar220 = ZEXT1664(auVar116);
                fVar107 = local_484;
                if ((float)local_428._0_4_ <= fVar196) break;
                auVar102 = _local_458;
                auVar100 = _local_3a8;
                if (fVar196 < (float)local_4a8._0_4_) {
                  fVar107 = fVar196 - (float)local_448._0_4_;
                  local_2f8._0_4_ = auVar116._0_4_;
                  local_448 = ZEXT416((uint)fVar196);
                  auVar120._0_4_ = fVar107 * (float)local_3a8._0_4_;
                  auVar120._4_4_ = fVar107 * (float)local_3a8._4_4_;
                  auVar120._8_4_ = fVar107 * fStack_3a0;
                  auVar120._12_4_ = fVar107 * fStack_39c;
                  auVar47._8_4_ = 0x3fb8aa3b;
                  auVar47._0_8_ = 0x3fb8aa3b3fb8aa3b;
                  auVar47._12_4_ = 0x3fb8aa3b;
                  auVar116 = vmulps_avx512vl(auVar120,auVar47);
                  _local_2c8 = vroundps_avx(auVar116,9);
                  auVar116 = vsubps_avx(auVar116,_local_2c8);
                  auVar158._8_4_ = 0x3da00ac9;
                  auVar158._0_8_ = 0x3da00ac93da00ac9;
                  auVar158._12_4_ = 0x3da00ac9;
                  auVar48._8_4_ = 0x3e679a0b;
                  auVar48._0_8_ = 0x3e679a0b3e679a0b;
                  auVar48._12_4_ = 0x3e679a0b;
                  auVar102 = vfmadd213ps_avx512vl(auVar158,auVar116,auVar48);
                  auVar49._8_4_ = 0x3f321004;
                  auVar49._0_8_ = 0x3f3210043f321004;
                  auVar49._12_4_ = 0x3f321004;
                  auVar102 = vfmadd213ps_avx512vl(auVar102,auVar116,auVar49);
                  auVar50._8_4_ = 0x3f800000;
                  auVar50._0_8_ = 0x3f8000003f800000;
                  auVar50._12_4_ = 0x3f800000;
                  local_2b8 = vfmadd213ps_avx512vl(auVar102,auVar116,auVar50);
                  fVar214 = fVar196 * local_480.d.super_Tuple3<pbrt::Vector3,_float>.x +
                            local_480.o.super_Tuple3<pbrt::Point3,_float>.x;
                  fVar205 = fVar196 * local_480.d.super_Tuple3<pbrt::Vector3,_float>.y +
                            local_480.o.super_Tuple3<pbrt::Point3,_float>.y;
                  _local_388 = CONCAT412(fVar196 * 0.0 + 0.0,
                                         CONCAT48(fVar196 * 0.0 + 0.0,CONCAT44(fVar205,fVar214)));
                  fVar107 = fVar196 * local_480.d.super_Tuple3<pbrt::Vector3,_float>.z +
                            local_480.o.super_Tuple3<pbrt::Point3,_float>.z;
                  local_408._0_4_ = fVar107;
                  p_00.super_Tuple3<pbrt::Point3,_float>.z = fVar107;
                  p_00.super_Tuple3<pbrt::Point3,_float>.x = fVar214;
                  p_00.super_Tuple3<pbrt::Point3,_float>.y = fVar205;
                  auVar146 = SUB6456(ZEXT6064((undefined1  [60])0x0),4);
                  auVar192 = ZEXT856(local_388._8_8_);
                  SVar259 = CloudMediumProvider::Density
                                      ((CloudMediumProvider *)*puVar83,p_00,lambda);
                  auVar176._0_8_ = SVar259.values.values._8_8_;
                  auVar176._8_56_ = auVar146;
                  auVar134._0_8_ = SVar259.values.values._0_8_;
                  auVar134._8_56_ = auVar192;
                  auVar202._0_4_ = (int)(float)local_2c8._0_4_;
                  auVar202._4_4_ = (int)(float)local_2c8._4_4_;
                  auVar202._8_4_ = (int)(float)uStack_2c0;
                  auVar202._12_4_ = (int)uStack_2c0._4_4_;
                  auVar218._8_4_ = 0xffffff81;
                  auVar218._0_8_ = 0xffffff81ffffff81;
                  auVar218._12_4_ = 0xffffff81;
                  auVar102 = vmovlhps_avx(auVar134._0_16_,auVar176._0_16_);
                  auVar100 = vpsrld_avx(local_2b8,0x17);
                  auVar116 = vpaddd_avx(auVar202,auVar218);
                  auVar116 = vpaddd_avx(auVar116,auVar100);
                  auVar51._8_4_ = 0x7f;
                  auVar51._0_8_ = 0x7f0000007f;
                  auVar51._12_4_ = 0x7f;
                  uVar78 = vpcmpgtd_avx512vl(auVar116,auVar51);
                  uVar78 = uVar78 & 0xf;
                  auVar52._8_4_ = 0x807fffff;
                  auVar52._0_8_ = 0x807fffff807fffff;
                  auVar52._12_4_ = 0x807fffff;
                  auVar100 = vpandd_avx512vl(local_2b8,auVar52);
                  uVar80 = vpcmpgtd_avx512vl(auVar116,auVar218);
                  uVar80 = uVar80 & 0xf;
                  auVar116 = vpslld_avx(auVar116,0x17);
                  auVar53._8_4_ = 0x3f800000;
                  auVar53._0_8_ = 0x3f8000003f800000;
                  auVar53._12_4_ = 0x3f800000;
                  auVar116 = vpaddd_avx512vl(auVar116,auVar53);
                  auVar116 = vpord_avx512vl(auVar116,auVar100);
                  local_228.values.values[0] = auVar102._0_4_ * local_1d8;
                  local_228.values.values[1] = auVar102._4_4_ * fStack_1d4;
                  local_228.values.values[2] = auVar102._8_4_ * fStack_1d0;
                  local_228.values.values[3] = auVar102._12_4_ * fStack_1cc;
                  auVar100 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                  bVar96 = (bool)((byte)uVar78 & 1);
                  bVar13 = (bool)((byte)(uVar78 >> 1) & 1);
                  bVar10 = (bool)((byte)(uVar78 >> 2) & 1);
                  bVar11 = SUB81(uVar78 >> 3,0);
                  local_1f8.values.values[0] =
                       (float)((uint)bVar96 * auVar100._0_4_ |
                              (uint)!bVar96 * (uint)((byte)uVar80 & 1) * auVar116._0_4_) *
                       local_4b8.values[0];
                  local_1f8.values.values[1] =
                       (float)((uint)bVar13 * auVar100._4_4_ |
                              (uint)!bVar13 * (uint)((byte)(uVar80 >> 1) & 1) * auVar116._4_4_) *
                       local_4b8.values[1];
                  local_1f8.values.values[2] =
                       (float)((uint)bVar10 * auVar100._8_4_ |
                              (uint)!bVar10 * (uint)((byte)(uVar80 >> 2) & 1) * auVar116._8_4_) *
                       local_4b8.values[2];
                  local_1f8.values.values[3] =
                       (float)((uint)bVar11 * auVar100._12_4_ |
                              (uint)!bVar11 * (uint)(byte)(uVar80 >> 3) * auVar116._12_4_) *
                       local_4b8.values[3];
                  auVar116 = vmovshdup_avx(_local_388);
                  fVar107 = auVar116._0_4_;
                  auVar116 = vfmadd231ss_fma(ZEXT416((uint)(fVar107 *
                                                           *(float *)((long)puVar83 + 0x7c))),
                                             _local_388,ZEXT416(*(uint *)(puVar83 + 0xf)));
                  auVar100 = vfmadd231ss_fma(ZEXT416((uint)(fVar107 *
                                                           *(float *)((long)puVar83 + 0x8c))),
                                             _local_388,ZEXT416(*(uint *)(puVar83 + 0x11)));
                  auVar111 = vfmadd231ss_fma(ZEXT416((uint)(fVar107 *
                                                           *(float *)((long)puVar83 + 0x9c))),
                                             _local_388,ZEXT416(*(uint *)(puVar83 + 0x13)));
                  auVar152 = vfmadd231ss_fma(ZEXT416((uint)(fVar107 *
                                                           *(float *)((long)puVar83 + 0xac))),
                                             _local_388,ZEXT416(*(uint *)(puVar83 + 0x15)));
                  auVar116 = vfmadd231ss_fma(auVar116,ZEXT416((uint)local_408._0_4_),
                                             ZEXT416(*(uint *)(puVar83 + 0x10)));
                  auVar100 = vfmadd231ss_fma(auVar100,ZEXT416((uint)local_408._0_4_),
                                             ZEXT416(*(uint *)(puVar83 + 0x12)));
                  auVar111 = vfmadd231ss_fma(auVar111,ZEXT416((uint)local_408._0_4_),
                                             ZEXT416(*(uint *)(puVar83 + 0x14)));
                  auVar152 = vfmadd231ss_fma(auVar152,ZEXT416((uint)local_408._0_4_),
                                             ZEXT416(*(uint *)(puVar83 + 0x16)));
                  fVar107 = auVar152._0_4_ + *(float *)((long)puVar83 + 0xb4);
                  fVar196 = auVar116._0_4_ + *(float *)((long)puVar83 + 0x84);
                  fVar214 = auVar100._0_4_ + *(float *)((long)puVar83 + 0x94);
                  fVar205 = auVar111._0_4_ + *(float *)((long)puVar83 + 0xa4);
                  bVar96 = fVar107 == 1.0;
                  iVar97 = (uint)bVar96 * (int)fVar205 + (uint)!bVar96 * (int)(fVar205 / fVar107);
                  iVar98 = (uint)bVar96 * (int)fVar196 + (uint)!bVar96 * (int)(fVar196 / fVar107);
                  iVar99 = (uint)bVar96 * (int)fVar214 + (uint)!bVar96 * (int)(fVar214 / fVar107);
                  auVar242._4_4_ = iVar98;
                  auVar242._0_4_ = iVar98;
                  auVar242._8_4_ = iVar98;
                  auVar242._12_4_ = iVar98;
                  auVar246._4_4_ = iVar99;
                  auVar246._0_4_ = iVar99;
                  auVar246._8_4_ = iVar99;
                  auVar246._12_4_ = iVar99;
                  auVar210._4_4_ = iVar97;
                  auVar210._0_4_ = iVar97;
                  auVar210._8_4_ = iVar97;
                  auVar210._12_4_ = iVar97;
                  local_290._0_16_ = vmovlhps_avx(auVar242,auVar246);
                  local_290._40_16_ = ZEXT416(0) << 0x20;
                  auVar251._0_4_ = local_320._12_4_ * local_320._12_4_;
                  auVar251._4_4_ = local_320._16_4_ * local_320._16_4_;
                  auVar251._8_8_ = 0;
                  auVar235._0_8_ = local_320._12_8_ ^ 0x8000000080000000;
                  auVar235._8_4_ = 0x80000000;
                  auVar235._12_4_ = 0x80000000;
                  auVar116 = vhaddps_avx(auVar251,auVar251);
                  auVar116 = ZEXT416((uint)(auVar116._0_4_ + fStack_30c * fStack_30c));
                  auVar116 = vsqrtss_avx(auVar116,auVar116);
                  local_290._36_4_ = auVar116._0_4_;
                  auVar252._4_4_ = local_290._36_4_;
                  auVar252._0_4_ = local_290._36_4_;
                  auVar252._8_4_ = local_290._36_4_;
                  auVar252._12_4_ = local_290._36_4_;
                  local_290._36_4_ = -fStack_30c / (float)local_290._36_4_;
                  auVar116 = vdivps_avx(auVar235,auVar252);
                  local_258 = 0.0;
                  local_290._16_8_ = vmovlps_avx(auVar210);
                  local_290._24_4_ = FStack_308;
                  local_290._28_8_ = vmovlps_avx(auVar116);
                  local_250 = (MediumInterface *)0x0;
                  local_238.values.values[1] = auVar102._4_4_ * (float)local_2d8._4_4_;
                  local_238.values.values[0] = auVar102._0_4_ * (float)local_2d8._0_4_;
                  local_238.values.values[2] = auVar102._8_4_ * fStack_2d0;
                  local_238.values.values[3] = auVar102._12_4_ * fStack_2cc;
                  local_218._16_16_ = local_290._40_16_;
                  local_218._0_16_ = _local_458;
                  local_248.bits = (uintptr_t)(TVar7.bits | 0x3000000000000);
                  local_240.bits = (long)puVar83 + 0x74U | 0x1000000000000;
                  bVar96 = Li::anon_class_88_11_08f5f5b0::operator()
                                     ((anon_class_88_11_08f5f5b0 *)local_378,
                                      (MediumSample *)local_290);
                  auVar220 = ZEXT464((uint)local_2f8._0_4_);
                  auVar255 = ZEXT1664(local_448);
                  local_4b8.values[2] = 1.0;
                  local_4b8.values[0] = 1.0;
                  local_4b8.values[1] = 1.0;
                  local_4b8.values[3] = 1.0;
                  fVar107 = local_484;
                  auVar102 = _local_458;
                  auVar100 = _local_3a8;
                  if (!bVar96) goto LAB_003e6ff6;
                }
              }
              fVar196 = (float)local_428._0_4_ - (float)local_448._0_4_;
              auVar119._0_4_ = fVar196 * (float)local_3a8._0_4_;
              auVar119._4_4_ = fVar196 * (float)local_3a8._4_4_;
              auVar119._8_4_ = fVar196 * fStack_3a0;
              auVar119._12_4_ = fVar196 * fStack_39c;
            }
            else {
              fVar196 = auVar116._0_4_ - auVar255._0_4_;
              auVar119._0_4_ = fVar196 * auVar100._0_4_;
              auVar119._4_4_ = fVar196 * auVar100._4_4_;
              auVar119._8_4_ = fVar196 * auVar100._8_4_;
              auVar119._12_4_ = fVar196 * auVar100._12_4_;
            }
            auVar209._8_4_ = 0xffffff81;
            auVar209._0_8_ = 0xffffff81ffffff81;
            auVar201._8_4_ = 0x3da00ac9;
            auVar201._0_8_ = 0x3da00ac93da00ac9;
            auVar209._12_4_ = 0xffffff81;
            auVar201._12_4_ = 0x3da00ac9;
            auVar40._8_4_ = 0x3fb8aa3b;
            auVar40._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar40._12_4_ = 0x3fb8aa3b;
            auVar102 = vmulps_avx512vl(auVar119,auVar40);
            auVar116 = vroundps_avx(auVar102,9);
            auVar102 = vsubps_avx(auVar102,auVar116);
            auVar41._8_4_ = 0x3e679a0b;
            auVar41._0_8_ = 0x3e679a0b3e679a0b;
            auVar41._12_4_ = 0x3e679a0b;
            auVar100 = vfmadd213ps_avx512vl(auVar201,auVar102,auVar41);
            auVar159._0_4_ = (int)auVar116._0_4_;
            auVar159._4_4_ = (int)auVar116._4_4_;
            auVar159._8_4_ = (int)auVar116._8_4_;
            auVar159._12_4_ = (int)auVar116._12_4_;
            auVar116 = vpaddd_avx(auVar159,auVar209);
            auVar42._8_4_ = 0x3f321004;
            auVar42._0_8_ = 0x3f3210043f321004;
            auVar42._12_4_ = 0x3f321004;
            auVar100 = vfmadd213ps_avx512vl(auVar100,auVar102,auVar42);
            auVar43._8_4_ = 0x3f800000;
            auVar43._0_8_ = 0x3f8000003f800000;
            auVar43._12_4_ = 0x3f800000;
            auVar102 = vfmadd213ps_avx512vl(auVar100,auVar102,auVar43);
            auVar100 = vpsrld_avx(auVar102,0x17);
            auVar116 = vpaddd_avx(auVar116,auVar100);
            auVar44._8_4_ = 0x7f;
            auVar44._0_8_ = 0x7f0000007f;
            auVar44._12_4_ = 0x7f;
            uVar78 = vpcmpgtd_avx512vl(auVar116,auVar44);
            uVar78 = uVar78 & 0xf;
            auVar45._8_4_ = 0x807fffff;
            auVar45._0_8_ = 0x807fffff807fffff;
            auVar45._12_4_ = 0x807fffff;
            auVar102 = vpandd_avx512vl(auVar102,auVar45);
            uVar80 = vpcmpgtd_avx512vl(auVar116,auVar209);
            uVar80 = uVar80 & 0xf;
            auVar116 = vpslld_avx(auVar116,0x17);
            auVar46._8_4_ = 0x3f800000;
            auVar46._0_8_ = 0x3f8000003f800000;
            auVar46._12_4_ = 0x3f800000;
            auVar116 = vpaddd_avx512vl(auVar116,auVar46);
            auVar116 = vpord_avx512vl(auVar116,auVar102);
            auVar102 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            bVar96 = (bool)((byte)uVar78 & 1);
            bVar13 = (bool)((byte)(uVar78 >> 1) & 1);
            bVar10 = (bool)((byte)(uVar78 >> 2) & 1);
            bVar11 = SUB81(uVar78 >> 3,0);
            fVar148 = (float)((uint)bVar96 * auVar102._0_4_ |
                             (uint)!bVar96 * (uint)((byte)uVar80 & 1) * auVar116._0_4_) *
                      local_4b8.values[0];
            fVar186 = (float)((uint)bVar13 * auVar102._4_4_ |
                             (uint)!bVar13 * (uint)((byte)(uVar80 >> 1) & 1) * auVar116._4_4_) *
                      local_4b8.values[1];
            fVar189 = (float)((uint)bVar10 * auVar102._8_4_ |
                             (uint)!bVar10 * (uint)((byte)(uVar80 >> 2) & 1) * auVar116._8_4_) *
                      local_4b8.values[2];
            fVar194 = (float)((uint)bVar11 * auVar102._12_4_ |
                             (uint)!bVar11 * (uint)(byte)(uVar80 >> 3) * auVar116._12_4_) *
                      local_4b8.values[3];
            local_4b8.values[0] = fVar148;
            local_4b8.values[1] = fVar186;
            local_4b8.values[2] = fVar189;
            local_4b8.values[3] = fVar194;
            if (((float)local_4a8._0_4_ < fVar107) ||
               (uVar77 = local_4d0[lVar90], uVar85 = local_3ec[lVar90 + 3],
               local_4d0[lVar90] = uVar77 + uVar85, puVar92 = local_490, puVar91 = local_498,
               uVar77 + uVar85 == local_3ec[lVar90])) break;
            auVar255 = ZEXT464((uint)local_428._0_4_);
            local_4c4[lVar90] = fVar107 + local_3d4[lVar90];
            uVar78 = (ulong)*puVar92;
            uVar77 = *puVar91;
          }
        }
        else {
          local_320._0_8_ = vmovlps_avx(auVar102);
          local_378._0_8_ = &local_430;
          local_378._8_8_ = &local_398;
          local_378._16_8_ = &local_2a8;
          local_378._32_8_ = &local_4f6;
          unique0x00005300 = &local_42c;
          local_330 = &local_4f5;
          local_328 = &local_3c8;
          local_348 = local_3f8;
          local_340 = local_410;
          local_338 = local_3b8;
          puVar83 = (undefined8 *)(TVar7.bits & 0xffffffffffff);
          local_4f4 = (float)local_4a8._0_4_;
          local_320._8_4_ = fVar107;
          local_300.bits = TVar7.bits;
          Transform::ApplyInverse
                    (&local_480,(Transform *)(puVar83 + 0xf),(Ray *)local_320,&local_4f4);
          auVar111._8_8_ = 0;
          auVar111._0_4_ = local_480.d.super_Tuple3<pbrt::Vector3,_float>.x;
          auVar111._4_4_ = local_480.d.super_Tuple3<pbrt::Vector3,_float>.y;
          auVar102 = ZEXT816(0) << 0x40;
          bVar96 = false;
          uVar77 = 0;
          auVar152._0_4_ =
               local_480.d.super_Tuple3<pbrt::Vector3,_float>.x *
               local_480.d.super_Tuple3<pbrt::Vector3,_float>.x;
          auVar152._4_4_ =
               local_480.d.super_Tuple3<pbrt::Vector3,_float>.y *
               local_480.d.super_Tuple3<pbrt::Vector3,_float>.y;
          auVar152._8_8_ = 0;
          auVar116 = vhaddps_avx(auVar152,auVar152);
          auVar116 = ZEXT416((uint)(auVar116._0_4_ +
                                   local_480.d.super_Tuple3<pbrt::Vector3,_float>.z *
                                   local_480.d.super_Tuple3<pbrt::Vector3,_float>.z));
          auVar116 = vsqrtss_avx(auVar116,auVar116);
          fVar107 = auVar116._0_4_;
          local_480.d.super_Tuple3<pbrt::Vector3,_float>.z =
               local_480.d.super_Tuple3<pbrt::Vector3,_float>.z / fVar107;
          local_4a8._0_4_ = fVar107 * local_4f4;
          local_4f4 = fVar107 * local_4f4;
          auVar103._4_4_ = fVar107;
          auVar103._0_4_ = fVar107;
          auVar103._8_4_ = fVar107;
          auVar103._12_4_ = fVar107;
          auVar116 = vdivps_avx(auVar111,auVar103);
          uVar78 = vmovlps_avx(auVar116);
          local_480.d.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar78;
          local_480.d.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)(uVar78 >> 0x20);
          auVar100 = vmovshdup_avx(auVar116);
          fVar196 = 1.0 / auVar116._0_4_;
          fVar214 = 1.0 / local_480.d.super_Tuple3<pbrt::Vector3,_float>.z;
          fVar107 = 1.0 / auVar100._0_4_;
          auVar192 = (undefined1  [56])0x0;
          do {
            auVar116 = ZEXT416((uint)(fVar196 *
                                     (*(float *)(puVar83 + 1) -
                                     local_480.o.super_Tuple3<pbrt::Point3,_float>.x)));
            pfVar88 = (float *)((long)puVar83 + 0x14);
            pRVar89 = &local_480;
            fVar205 = fVar196;
            if ((uVar77 != 0) &&
               (auVar116 = ZEXT416((uint)(fVar107 *
                                         (*(float *)((long)puVar83 + 0xc) -
                                         local_480.o.super_Tuple3<pbrt::Point3,_float>.y))),
               pfVar88 = (float *)(puVar83 + 3),
               pRVar89 = (Ray *)((long)&local_480.o.super_Tuple3<pbrt::Point3,_float> + 4),
               fVar205 = fVar107, uVar77 != 1)) {
              auVar116 = ZEXT416((uint)(fVar214 *
                                       (*(float *)(puVar83 + 2) -
                                       local_480.o.super_Tuple3<pbrt::Point3,_float>.z)));
              pfVar88 = (float *)((long)puVar83 + 0x1c);
              pRVar89 = (Ray *)((long)&local_480.o.super_Tuple3<pbrt::Point3,_float> + 8);
              fVar205 = fVar214;
            }
            auVar111 = ZEXT416((uint)((*pfVar88 - (pRVar89->o).super_Tuple3<pbrt::Point3,_float>.x)
                                     * fVar205));
            auVar100 = vminss_avx(auVar111,auVar116);
            auVar116 = vmaxss_avx(auVar116,auVar111);
            auVar102 = vmaxss_avx(auVar100,auVar102);
            auVar116 = vminss_avx(ZEXT416((uint)(auVar116._0_4_ * 1.0000004)),
                                  ZEXT416((uint)local_4a8._0_4_));
            local_4a8._0_4_ = auVar116._0_4_;
            if (auVar116._0_4_ < auVar102._0_4_) {
              if (!bVar96) goto LAB_003e6ff6;
              break;
            }
            bVar96 = 1 < uVar77;
            uVar77 = uVar77 + 1;
          } while (uVar77 != 3);
          uVar144 = 0;
          _local_458 = ZEXT416(*(uint *)(puVar83 + 0xe));
          local_448 = auVar102;
          SVar259 = DenselySampledSpectrum::Sample((DenselySampledSpectrum *)(puVar83 + 4),lambda);
          auVar220._0_8_ = SVar259.values.values._8_8_;
          auVar220._8_56_ = auVar192;
          local_428._8_8_ = uVar144;
          local_428._0_8_ = SVar259.values.values._0_8_;
          local_4b8.values = auVar220._0_16_;
          auVar146 = (undefined1  [56])0x0;
          local_408 = ZEXT416(*(uint *)(puVar83 + 0xe));
          SVar259 = DenselySampledSpectrum::Sample((DenselySampledSpectrum *)(puVar83 + 9),lambda);
          auVar177._0_8_ = SVar259.values.values._8_8_;
          auVar177._8_56_ = auVar192;
          auVar255._0_8_ = SVar259.values.values._0_8_;
          auVar255._8_56_ = auVar146;
          auVar116 = vmovlhps_avx(auVar255._0_16_,auVar177._0_16_);
          auVar227._4_4_ = local_480.o.super_Tuple3<pbrt::Point3,_float>.y;
          auVar227._0_4_ = local_480.o.super_Tuple3<pbrt::Point3,_float>.x;
          auVar227._8_8_ = 0;
          auVar255 = ZEXT1664(local_448);
          auVar111 = ZEXT816(0) << 0x40;
          local_498 = (uint *)((long)puVar83 + 0x11c);
          lVar90 = 0;
          auVar102 = vunpcklpd_avx(local_428,(undefined1  [16])local_4b8.values);
          local_490 = (uint *)(puVar83 + 0x23);
          local_2d8._0_4_ = (float)local_458._0_4_ * auVar102._0_4_;
          local_2d8._4_4_ = (float)local_458._0_4_ * auVar102._4_4_;
          fStack_2d0 = (float)local_458._0_4_ * auVar102._8_4_;
          fStack_2cc = (float)local_458._0_4_ * auVar102._12_4_;
          local_1d8 = (float)local_408._0_4_ * auVar116._0_4_;
          fStack_1d4 = (float)local_408._0_4_ * auVar116._4_4_;
          fStack_1d0 = (float)local_408._0_4_ * auVar116._8_4_;
          fStack_1cc = (float)local_408._0_4_ * auVar116._12_4_;
          local_1e8 = local_1d8 + (float)local_2d8._0_4_;
          fStack_1e4 = fStack_1d4 + (float)local_2d8._4_4_;
          fStack_1e0 = fStack_1d0 + fStack_2d0;
          fStack_1dc = fStack_1cc + fStack_2cc;
          fVar107 = *(float *)(puVar83 + 2);
          fVar205 = *(float *)((long)puVar83 + 0x1c) - fVar107;
          uVar144 = vcmpss_avx512f(ZEXT416((uint)fVar107),
                                   ZEXT416((uint)*(float *)((long)puVar83 + 0x1c)),1);
          bVar13 = (bool)((byte)uVar144 & 1);
          auVar160._8_8_ = 0;
          auVar160._0_8_ = *(ulong *)((long)puVar83 + 0x14);
          auVar121._8_8_ = 0;
          auVar121._0_8_ = puVar83[1];
          auVar116 = vsubps_avx(auVar160,auVar121);
          auVar102 = vsubps_avx(auVar227,auVar121);
          uVar78 = vcmpps_avx512vl(auVar121,auVar160,1);
          auVar122._8_8_ = 0;
          auVar122._0_4_ = local_480.d.super_Tuple3<pbrt::Vector3,_float>.x;
          auVar122._4_4_ = local_480.d.super_Tuple3<pbrt::Vector3,_float>.y;
          auVar100 = vdivps_avx512vl(auVar102,auVar116);
          bVar96 = (bool)((byte)uVar78 & 1);
          auVar104._0_4_ = (float)((uint)bVar96 * auVar100._0_4_ | (uint)!bVar96 * auVar102._0_4_);
          bVar96 = (bool)((byte)(uVar78 >> 1) & 1);
          auVar104._4_4_ = (uint)bVar96 * auVar100._4_4_ | (uint)!bVar96 * auVar102._4_4_;
          bVar96 = (bool)((byte)(uVar78 >> 2) & 1);
          auVar104._8_4_ = (uint)bVar96 * auVar100._8_4_ | (uint)!bVar96 * auVar102._8_4_;
          bVar96 = (bool)((byte)(uVar78 >> 3) & 1);
          auVar104._12_4_ = (uint)bVar96 * auVar100._12_4_ | (uint)!bVar96 * auVar102._12_4_;
          auVar116 = vdivps_avx(auVar122,auVar116);
          auVar102 = vmovshdup_avx(auVar104);
          local_4e4 = local_480.d.super_Tuple3<pbrt::Vector3,_float>.z / fVar205;
          local_4f0 = vmovlps_avx(auVar116);
          fVar249 = local_448._0_4_;
          auVar100 = vmovshdup_avx(auVar116);
          fVar196 = fVar249 * auVar116._0_4_ + auVar104._0_4_;
          fVar214 = fVar249 * auVar100._0_4_ + auVar102._0_4_;
          uVar77 = *(uint *)((long)puVar83 + 0x11c);
          uVar85 = *(uint *)(puVar83 + 0x23);
          fVar107 = (float)((uint)bVar13 *
                            (int)((local_480.o.super_Tuple3<pbrt::Point3,_float>.z - fVar107) /
                                 fVar205) +
                           (uint)!bVar13 *
                           (int)(local_480.o.super_Tuple3<pbrt::Point3,_float>.z - fVar107)) +
                    fVar249 * local_4e4;
          fVar205 = (float)(int)uVar77;
          auVar258 = in_ZMM11._4_12_;
          auVar228._0_4_ = (float)(int)(uVar77 - 1);
          auVar228._4_12_ = auVar258;
          auVar236._0_4_ = (float)(int)(uVar85 - 1);
          auVar236._4_12_ = auVar258;
          auVar116 = vminss_avx(auVar228,ZEXT416((uint)(fVar214 * fVar205)));
          uVar144 = vcmpss_avx512f(ZEXT416((uint)(fVar214 * fVar205)),auVar111,1);
          fVar215 = (float)(int)uVar85;
          uVar86 = (uint)(float)((uint)!(bool)((byte)uVar144 & 1) * auVar116._0_4_);
          auVar116 = vminss_avx(auVar236,ZEXT416((uint)(fVar196 * fVar215)));
          uVar144 = vcmpss_avx512f(ZEXT416((uint)(fVar196 * fVar215)),auVar111,1);
          fVar221 = (float)*(int *)(puVar83 + 0x24);
          auVar243._0_4_ = (float)(*(int *)(puVar83 + 0x24) + -1);
          auVar243._4_12_ = auVar258;
          uVar94 = (uint)(float)((uint)!(bool)((byte)uVar144 & 1) * auVar116._0_4_);
          auVar116 = vminss_avx(auVar243,ZEXT416((uint)(fVar107 * fVar221)));
          uVar144 = vcmpss_avx512f(ZEXT416((uint)(fVar107 * fVar221)),auVar111,1);
          uVar87 = (uint)(float)((uint)!(bool)((byte)uVar144 & 1) * auVar116._0_4_);
          do {
            iVar97 = (int)lVar90;
            if (iVar97 == 1) {
              local_4d0[1] = uVar86;
              puVar91 = local_3ec + 1;
              puVar92 = local_3ec + 4;
              pfVar84 = local_3d4 + 1;
              pfVar88 = local_4c4 + 1;
              pfVar81 = (float *)((long)&local_4f0 + 4);
              uVar93 = uVar86;
            }
            else if (iVar97 == 0) {
              local_4d0[lVar90] = uVar94;
              puVar91 = local_3ec;
              puVar92 = local_3ec + 3;
              pfVar84 = local_3d4;
              pfVar88 = local_4c4;
              pfVar81 = (float *)&local_4f0;
              uVar93 = uVar94;
            }
            else {
              puVar91 = local_3ec + 2;
              puVar92 = local_3ec + 5;
              pfVar84 = local_3d4 + 2;
              pfVar88 = local_4c4 + 2;
              pfVar81 = &local_4e4;
              local_4d0[lVar90] = uVar87;
              uVar93 = uVar87;
            }
            if ((*pfVar81 == 0.0) && (!NAN(*pfVar81))) {
              pfVar81 = (float *)&local_4f0;
              if ((iVar97 != 0) && (pfVar81 = (float *)((long)&local_4f0 + 4), iVar97 != 1)) {
                pfVar81 = &local_4e4;
              }
              *pfVar81 = 0.0;
            }
            pfVar81 = (float *)&local_4f0;
            if ((iVar97 != 0) && (pfVar81 = (float *)((long)&local_4f0 + 4), iVar97 != 1)) {
              pfVar81 = &local_4e4;
            }
            if (0.0 <= *pfVar81) {
              fVar230 = (float)(int)(uVar93 + 1);
              if (iVar97 == 1) {
                *pfVar88 = fVar249 + (fVar230 / fVar205 - fVar214) / local_4f0._4_4_;
                fVar230 = local_4f0._4_4_ * fVar205;
                puVar82 = local_498;
              }
              else if (iVar97 == 0) {
                *pfVar88 = fVar249 + (fVar230 / fVar215 - fVar196) / (float)local_4f0;
                fVar230 = (float)local_4f0 * fVar215;
                puVar82 = local_490;
              }
              else {
                *pfVar88 = fVar249 + (fVar230 / fVar221 - fVar107) / local_4e4;
                fVar230 = local_4e4 * fVar221;
                puVar82 = (uint *)(puVar83 + 0x24);
              }
              *puVar92 = 1;
              *pfVar84 = 1.0 / fVar230;
              uVar93 = *puVar82;
            }
            else {
              fVar230 = (float)(int)uVar93;
              if (iVar97 == 1) {
                fVar230 = fVar230 / fVar205 - fVar214;
                puVar82 = local_498;
                fVar231 = local_4f0._4_4_;
              }
              else if (iVar97 == 0) {
                fVar230 = fVar230 / fVar215 - fVar196;
                puVar82 = local_490;
                fVar231 = (float)local_4f0;
              }
              else {
                fVar230 = fVar230 / fVar221 - fVar107;
                puVar82 = (uint *)(puVar83 + 0x24);
                fVar231 = local_4e4;
              }
              *pfVar88 = fVar249 + fVar230 / fVar231;
              uVar6 = *puVar82;
              *puVar92 = 0xffffffff;
              uVar93 = 0xffffffff;
              *pfVar84 = -1.0 / (fVar231 * (float)(int)uVar6);
            }
            lVar90 = lVar90 + 1;
            *puVar91 = uVar93;
          } while (lVar90 != 3);
          auVar220 = ZEXT464((uint)local_2f8._0_4_);
          local_4b8.values[2] = 1.0;
          local_4b8.values[0] = 1.0;
          local_4b8.values[1] = 1.0;
          local_4b8.values[3] = 1.0;
          while( true ) {
            auVar73._4_4_ = fStack_1e4;
            auVar73._0_4_ = local_1e8;
            auVar73._8_4_ = fStack_1e0;
            auVar73._12_4_ = fStack_1dc;
            lVar90 = (long)*(int *)(&DAT_0056d940 +
                                   (ulong)((uint)(local_4c4[1] < local_4c4[2]) |
                                          (uint)(local_4c4[0] < local_4c4[1]) * 4 +
                                          (uint)(local_4c4[0] < local_4c4[2]) * 2) * 4);
            fVar107 = local_4c4[lVar90];
            uVar1 = *(undefined4 *)
                     (puVar83[0x20] +
                     ((long)(int)((uVar77 * local_4d0[2] + local_4d0[1]) * uVar85) +
                     (long)(int)local_4d0[0]) * 4);
            auVar54._4_4_ = uVar1;
            auVar54._0_4_ = uVar1;
            auVar54._8_4_ = uVar1;
            auVar54._12_4_ = uVar1;
            auVar102 = vmulps_avx512vl(auVar73,auVar54);
            auVar116 = vminss_avx(ZEXT416((uint)fVar107),ZEXT416((uint)local_4a8._0_4_));
            auVar55._8_4_ = 0x80000000;
            auVar55._0_8_ = 0x8000000080000000;
            auVar55._12_4_ = 0x80000000;
            auVar100 = vxorps_avx512vl(auVar102,auVar55);
            local_428._0_4_ = auVar116._0_4_;
            if ((auVar102._0_4_ != 0.0) || (NAN(auVar102._0_4_))) {
              while( true ) {
                _local_3a8 = auVar100;
                _local_458 = auVar102;
                local_484 = fVar107;
                local_448._0_4_ = auVar255._0_4_;
                fVar107 = logf(1.0 - auVar220._0_4_);
                uVar75 = local_3c8.state;
                uVar78 = local_3c8.state >> 0x1b;
                local_3c8.state = local_3c8.state * 0x5851f42d4c957f2d + local_3c8.inc;
                uVar77 = (uint)(uVar75 >> 0x2d) ^ (uint)uVar78;
                bVar79 = (byte)(uVar75 >> 0x3b);
                fVar196 = (float)local_448._0_4_ - fVar107 / (float)local_458._0_4_;
                auVar255 = ZEXT464((uint)fVar196);
                auVar116 = vcvtusi2ss_avx512f(in_ZMM13._0_16_,
                                              uVar77 >> bVar79 | uVar77 << 0x20 - bVar79);
                auVar116 = vminss_avx(ZEXT416((uint)(auVar116._0_4_ * 2.3283064e-10)),
                                      ZEXT416(0x3f7fffff));
                auVar220 = ZEXT1664(auVar116);
                fVar107 = local_484;
                if ((float)local_428._0_4_ <= fVar196) break;
                auVar102 = _local_458;
                auVar100 = _local_3a8;
                if (fVar196 < (float)local_4a8._0_4_) {
                  fVar107 = fVar196 - (float)local_448._0_4_;
                  local_2f8._0_4_ = auVar116._0_4_;
                  local_448 = ZEXT416((uint)fVar196);
                  auVar124._0_4_ = fVar107 * (float)local_3a8._0_4_;
                  auVar124._4_4_ = fVar107 * (float)local_3a8._4_4_;
                  auVar124._8_4_ = fVar107 * fStack_3a0;
                  auVar124._12_4_ = fVar107 * fStack_39c;
                  auVar63._8_4_ = 0x3fb8aa3b;
                  auVar63._0_8_ = 0x3fb8aa3b3fb8aa3b;
                  auVar63._12_4_ = 0x3fb8aa3b;
                  auVar116 = vmulps_avx512vl(auVar124,auVar63);
                  _local_388 = vroundps_avx(auVar116,9);
                  auVar116 = vsubps_avx(auVar116,_local_388);
                  auVar161._8_4_ = 0x3da00ac9;
                  auVar161._0_8_ = 0x3da00ac93da00ac9;
                  auVar161._12_4_ = 0x3da00ac9;
                  auVar64._8_4_ = 0x3e679a0b;
                  auVar64._0_8_ = 0x3e679a0b3e679a0b;
                  auVar64._12_4_ = 0x3e679a0b;
                  auVar102 = vfmadd213ps_avx512vl(auVar161,auVar116,auVar64);
                  auVar65._8_4_ = 0x3f321004;
                  auVar65._0_8_ = 0x3f3210043f321004;
                  auVar65._12_4_ = 0x3f321004;
                  auVar102 = vfmadd213ps_avx512vl(auVar102,auVar116,auVar65);
                  auVar66._8_4_ = 0x3f800000;
                  auVar66._0_8_ = 0x3f8000003f800000;
                  auVar66._12_4_ = 0x3f800000;
                  local_408 = vfmadd213ps_avx512vl(auVar102,auVar116,auVar66);
                  local_4e0.super_Tuple3<pbrt::Point3,_float>.z =
                       fVar196 * local_480.d.super_Tuple3<pbrt::Vector3,_float>.z +
                       local_480.o.super_Tuple3<pbrt::Point3,_float>.z;
                  auVar192 = (undefined1  [56])0x0;
                  auVar162._0_4_ =
                       fVar196 * local_480.d.super_Tuple3<pbrt::Vector3,_float>.x +
                       local_480.o.super_Tuple3<pbrt::Point3,_float>.x;
                  auVar162._4_4_ =
                       fVar196 * local_480.d.super_Tuple3<pbrt::Vector3,_float>.y +
                       local_480.o.super_Tuple3<pbrt::Point3,_float>.y;
                  auVar162._8_4_ = fVar196 * 0.0 + 0.0;
                  auVar162._12_4_ = fVar196 * 0.0 + 0.0;
                  auVar146 = ZEXT856(auVar162._8_8_);
                  uVar144 = vmovlps_avx(auVar162);
                  local_4e0.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar144;
                  local_4e0.super_Tuple3<pbrt::Point3,_float>.y = (float)((ulong)uVar144 >> 0x20);
                  SVar259 = NanoVDBMediumProvider::Density
                                      ((NanoVDBMediumProvider *)*puVar83,&local_4e0,lambda);
                  auVar178._0_8_ = SVar259.values.values._8_8_;
                  auVar178._8_56_ = auVar146;
                  auVar135._0_8_ = SVar259.values.values._0_8_;
                  auVar135._8_56_ = auVar192;
                  local_2b8 = auVar135._0_16_;
                  _local_2c8 = auVar178._0_16_;
                  SVar259 = NanoVDBMediumProvider::Le
                                      ((NanoVDBMediumProvider *)*puVar83,&local_4e0,lambda);
                  auVar179._0_8_ = SVar259.values.values._8_8_;
                  auVar179._8_56_ = auVar146;
                  auVar136._0_8_ = SVar259.values.values._0_8_;
                  auVar136._8_56_ = auVar192;
                  auVar204._0_4_ = (int)(float)local_388._0_4_;
                  auVar204._4_4_ = (int)(float)local_388._4_4_;
                  auVar204._8_4_ = (int)fStack_380;
                  auVar204._12_4_ = (int)fStack_37c;
                  auVar219._8_4_ = 0xffffff81;
                  auVar219._0_8_ = 0xffffff81ffffff81;
                  auVar219._12_4_ = 0xffffff81;
                  auVar102 = vpsrld_avx(local_408,0x17);
                  auVar116 = vpaddd_avx(auVar204,auVar219);
                  auVar116 = vpaddd_avx(auVar116,auVar102);
                  auVar67._8_4_ = 0x807fffff;
                  auVar67._0_8_ = 0x807fffff807fffff;
                  auVar67._12_4_ = 0x807fffff;
                  auVar103 = vpandd_avx512vl(local_408,auVar67);
                  auVar68._8_4_ = 0x7f;
                  auVar68._0_8_ = 0x7f0000007f;
                  auVar68._12_4_ = 0x7f;
                  uVar78 = vpcmpgtd_avx512vl(auVar116,auVar68);
                  uVar78 = uVar78 & 0xf;
                  auVar102 = vfmadd231ss_fma(ZEXT416((uint)(local_4e0.
                                                            super_Tuple3<pbrt::Point3,_float>.y *
                                                           *(float *)((long)puVar83 + 0x7c))),
                                             ZEXT416((uint)local_4e0.
                                                           super_Tuple3<pbrt::Point3,_float>.x),
                                             ZEXT416(*(uint *)(puVar83 + 0xf)));
                  auVar100 = vfmadd231ss_fma(ZEXT416((uint)(local_4e0.
                                                            super_Tuple3<pbrt::Point3,_float>.y *
                                                           *(float *)((long)puVar83 + 0xac))),
                                             ZEXT416((uint)local_4e0.
                                                           super_Tuple3<pbrt::Point3,_float>.x),
                                             ZEXT416(*(uint *)(puVar83 + 0x15)));
                  auVar111 = vfmadd231ss_fma(ZEXT416((uint)(local_4e0.
                                                            super_Tuple3<pbrt::Point3,_float>.y *
                                                           *(float *)((long)puVar83 + 0x8c))),
                                             ZEXT416((uint)local_4e0.
                                                           super_Tuple3<pbrt::Point3,_float>.x),
                                             ZEXT416(*(uint *)(puVar83 + 0x11)));
                  auVar152 = vfmadd231ss_fma(ZEXT416((uint)(local_4e0.
                                                            super_Tuple3<pbrt::Point3,_float>.y *
                                                           *(float *)((long)puVar83 + 0x9c))),
                                             ZEXT416((uint)local_4e0.
                                                           super_Tuple3<pbrt::Point3,_float>.x),
                                             ZEXT416(*(uint *)(puVar83 + 0x13)));
                  uVar80 = vpcmpgtd_avx512vl(auVar116,auVar219);
                  uVar80 = uVar80 & 0xf;
                  auVar116 = vpslld_avx(auVar116,0x17);
                  auVar69._8_4_ = 0x3f800000;
                  auVar69._0_8_ = 0x3f8000003f800000;
                  auVar69._12_4_ = 0x3f800000;
                  auVar104 = vpaddd_avx512vl(auVar116,auVar69);
                  auVar116 = vfmadd231ss_fma(auVar102,ZEXT416((uint)local_4e0.
                                                                                                                                        
                                                  super_Tuple3<pbrt::Point3,_float>.z),
                                             ZEXT416(*(uint *)(puVar83 + 0x10)));
                  auVar102 = vfmadd231ss_fma(auVar100,ZEXT416((uint)local_4e0.
                                                                                                                                        
                                                  super_Tuple3<pbrt::Point3,_float>.z),
                                             ZEXT416(*(uint *)(puVar83 + 0x16)));
                  auVar100 = vfmadd231ss_fma(auVar111,ZEXT416((uint)local_4e0.
                                                                                                                                        
                                                  super_Tuple3<pbrt::Point3,_float>.z),
                                             ZEXT416(*(uint *)(puVar83 + 0x12)));
                  auVar111 = vfmadd231ss_fma(auVar152,ZEXT416((uint)local_4e0.
                                                                                                                                        
                                                  super_Tuple3<pbrt::Point3,_float>.z),
                                             ZEXT416(*(uint *)(puVar83 + 0x14)));
                  fVar107 = auVar102._0_4_ + *(float *)((long)puVar83 + 0xb4);
                  fVar196 = auVar116._0_4_ + *(float *)((long)puVar83 + 0x84);
                  fVar214 = auVar100._0_4_ + *(float *)((long)puVar83 + 0x94);
                  fVar205 = auVar111._0_4_ + *(float *)((long)puVar83 + 0xa4);
                  auVar116 = vpord_avx512vl(auVar104,auVar103);
                  auVar100 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                  bVar96 = (bool)((byte)uVar78 & 1);
                  bVar13 = (bool)((byte)(uVar78 >> 1) & 1);
                  bVar10 = (bool)((byte)(uVar78 >> 2) & 1);
                  bVar11 = SUB81(uVar78 >> 3,0);
                  auVar102 = vunpcklpd_avx(local_2b8,_local_2c8);
                  local_238.values.values[0] = auVar102._0_4_ * (float)local_2d8._0_4_;
                  local_238.values.values[1] = auVar102._4_4_ * (float)local_2d8._4_4_;
                  local_238.values.values[2] = auVar102._8_4_ * fStack_2d0;
                  local_238.values.values[3] = auVar102._12_4_ * fStack_2cc;
                  bVar12 = fVar107 == 1.0;
                  local_1f8.values.values[0] =
                       (float)((uint)bVar96 * auVar100._0_4_ |
                              (uint)!bVar96 * (uint)((byte)uVar80 & 1) * auVar116._0_4_) *
                       local_4b8.values[0];
                  local_1f8.values.values[1] =
                       (float)((uint)bVar13 * auVar100._4_4_ |
                              (uint)!bVar13 * (uint)((byte)(uVar80 >> 1) & 1) * auVar116._4_4_) *
                       local_4b8.values[1];
                  local_1f8.values.values[2] =
                       (float)((uint)bVar10 * auVar100._8_4_ |
                              (uint)!bVar10 * (uint)((byte)(uVar80 >> 2) & 1) * auVar116._8_4_) *
                       local_4b8.values[2];
                  local_1f8.values.values[3] =
                       (float)((uint)bVar11 * auVar100._12_4_ |
                              (uint)!bVar11 * (uint)(byte)(uVar80 >> 3) * auVar116._12_4_) *
                       local_4b8.values[3];
                  iVar97 = (uint)bVar12 * (int)fVar196 + (uint)!bVar12 * (int)(fVar196 / fVar107);
                  iVar98 = (uint)bVar12 * (int)fVar205 + (uint)!bVar12 * (int)(fVar205 / fVar107);
                  iVar99 = (uint)bVar12 * (int)fVar214 + (uint)!bVar12 * (int)(fVar214 / fVar107);
                  auVar237._4_4_ = iVar97;
                  auVar237._0_4_ = iVar97;
                  auVar237._8_4_ = iVar97;
                  auVar237._12_4_ = iVar97;
                  auVar244._4_4_ = iVar99;
                  auVar244._0_4_ = iVar99;
                  auVar244._8_4_ = iVar99;
                  auVar244._12_4_ = iVar99;
                  auVar229._4_4_ = iVar98;
                  auVar229._0_4_ = iVar98;
                  auVar229._8_4_ = iVar98;
                  auVar229._12_4_ = iVar98;
                  local_290._0_16_ = vmovlhps_avx(auVar237,auVar244);
                  local_290._40_16_ = ZEXT416(0) << 0x20;
                  auVar253._0_4_ = local_320._12_4_ * local_320._12_4_;
                  auVar253._4_4_ = local_320._16_4_ * local_320._16_4_;
                  auVar253._8_8_ = 0;
                  auVar247._0_8_ = local_320._12_8_ ^ 0x8000000080000000;
                  auVar247._8_4_ = 0x80000000;
                  auVar247._12_4_ = 0x80000000;
                  auVar116 = vhaddps_avx(auVar253,auVar253);
                  auVar116 = ZEXT416((uint)(auVar116._0_4_ + fStack_30c * fStack_30c));
                  auVar116 = vsqrtss_avx(auVar116,auVar116);
                  local_218._16_16_ = vmovlhps_avx(auVar136._0_16_,auVar179._0_16_);
                  local_290._36_4_ = auVar116._0_4_;
                  auVar257._4_4_ = local_290._36_4_;
                  auVar257._0_4_ = local_290._36_4_;
                  auVar257._8_4_ = local_290._36_4_;
                  auVar257._12_4_ = local_290._36_4_;
                  local_290._36_4_ = -fStack_30c / (float)local_290._36_4_;
                  auVar116 = vdivps_avx(auVar247,auVar257);
                  in_ZMM11 = ZEXT1664(_local_458);
                  local_258 = 0.0;
                  local_290._16_8_ = vmovlps_avx(auVar229);
                  local_290._24_4_ = FStack_308;
                  local_290._28_8_ = vmovlps_avx(auVar116);
                  local_250 = (MediumInterface *)0x0;
                  local_228.values.values[1] = auVar102._4_4_ * fStack_1d4;
                  local_228.values.values[0] = auVar102._0_4_ * local_1d8;
                  local_228.values.values[2] = auVar102._8_4_ * fStack_1d0;
                  local_228.values.values[3] = auVar102._12_4_ * fStack_1cc;
                  local_218._0_16_ = _local_458;
                  local_248.bits = (uintptr_t)((ulong)puVar83 | 0x4000000000000);
                  local_240.bits = (long)puVar83 + 0x74U | 0x1000000000000;
                  bVar96 = Li::anon_class_88_11_08f5f5b0::operator()
                                     ((anon_class_88_11_08f5f5b0 *)local_378,
                                      (MediumSample *)local_290);
                  auVar220 = ZEXT464((uint)local_2f8._0_4_);
                  auVar255 = ZEXT1664(local_448);
                  local_4b8.values[2] = 1.0;
                  local_4b8.values[0] = 1.0;
                  local_4b8.values[1] = 1.0;
                  local_4b8.values[3] = 1.0;
                  fVar107 = local_484;
                  auVar102 = _local_458;
                  auVar100 = _local_3a8;
                  if (!bVar96) goto LAB_003e6ff6;
                }
              }
              fVar196 = (float)local_428._0_4_ - (float)local_448._0_4_;
              auVar123._0_4_ = fVar196 * (float)local_3a8._0_4_;
              auVar123._4_4_ = fVar196 * (float)local_3a8._4_4_;
              auVar123._8_4_ = fVar196 * fStack_3a0;
              auVar123._12_4_ = fVar196 * fStack_39c;
            }
            else {
              fVar196 = auVar116._0_4_ - auVar255._0_4_;
              auVar123._0_4_ = fVar196 * auVar100._0_4_;
              auVar123._4_4_ = fVar196 * auVar100._4_4_;
              auVar123._8_4_ = fVar196 * auVar100._8_4_;
              auVar123._12_4_ = fVar196 * auVar100._12_4_;
            }
            auVar211._8_4_ = 0xffffff81;
            auVar211._0_8_ = 0xffffff81ffffff81;
            auVar203._8_4_ = 0x3da00ac9;
            auVar203._0_8_ = 0x3da00ac93da00ac9;
            auVar211._12_4_ = 0xffffff81;
            auVar203._12_4_ = 0x3da00ac9;
            auVar56._8_4_ = 0x3fb8aa3b;
            auVar56._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar56._12_4_ = 0x3fb8aa3b;
            auVar102 = vmulps_avx512vl(auVar123,auVar56);
            auVar116 = vroundps_avx(auVar102,9);
            auVar102 = vsubps_avx(auVar102,auVar116);
            auVar57._8_4_ = 0x3e679a0b;
            auVar57._0_8_ = 0x3e679a0b3e679a0b;
            auVar57._12_4_ = 0x3e679a0b;
            auVar100 = vfmadd213ps_avx512vl(auVar203,auVar102,auVar57);
            auVar163._0_4_ = (int)auVar116._0_4_;
            auVar163._4_4_ = (int)auVar116._4_4_;
            auVar163._8_4_ = (int)auVar116._8_4_;
            auVar163._12_4_ = (int)auVar116._12_4_;
            auVar116 = vpaddd_avx(auVar163,auVar211);
            auVar58._8_4_ = 0x3f321004;
            auVar58._0_8_ = 0x3f3210043f321004;
            auVar58._12_4_ = 0x3f321004;
            auVar100 = vfmadd213ps_avx512vl(auVar100,auVar102,auVar58);
            auVar59._8_4_ = 0x3f800000;
            auVar59._0_8_ = 0x3f8000003f800000;
            auVar59._12_4_ = 0x3f800000;
            auVar102 = vfmadd213ps_avx512vl(auVar100,auVar102,auVar59);
            auVar100 = vpsrld_avx(auVar102,0x17);
            auVar116 = vpaddd_avx(auVar116,auVar100);
            auVar60._8_4_ = 0x7f;
            auVar60._0_8_ = 0x7f0000007f;
            auVar60._12_4_ = 0x7f;
            uVar78 = vpcmpgtd_avx512vl(auVar116,auVar60);
            uVar78 = uVar78 & 0xf;
            auVar61._8_4_ = 0x807fffff;
            auVar61._0_8_ = 0x807fffff807fffff;
            auVar61._12_4_ = 0x807fffff;
            auVar102 = vpandd_avx512vl(auVar102,auVar61);
            uVar80 = vpcmpgtd_avx512vl(auVar116,auVar211);
            uVar80 = uVar80 & 0xf;
            auVar116 = vpslld_avx(auVar116,0x17);
            auVar62._8_4_ = 0x3f800000;
            auVar62._0_8_ = 0x3f8000003f800000;
            auVar62._12_4_ = 0x3f800000;
            auVar116 = vpaddd_avx512vl(auVar116,auVar62);
            auVar116 = vpord_avx512vl(auVar116,auVar102);
            auVar102 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            bVar96 = (bool)((byte)uVar78 & 1);
            bVar13 = (bool)((byte)(uVar78 >> 1) & 1);
            bVar10 = (bool)((byte)(uVar78 >> 2) & 1);
            bVar11 = SUB81(uVar78 >> 3,0);
            fVar149 = (float)((uint)bVar96 * auVar102._0_4_ |
                             (uint)!bVar96 * (uint)((byte)uVar80 & 1) * auVar116._0_4_) *
                      local_4b8.values[0];
            fVar187 = (float)((uint)bVar13 * auVar102._4_4_ |
                             (uint)!bVar13 * (uint)((byte)(uVar80 >> 1) & 1) * auVar116._4_4_) *
                      local_4b8.values[1];
            fVar190 = (float)((uint)bVar10 * auVar102._8_4_ |
                             (uint)!bVar10 * (uint)((byte)(uVar80 >> 2) & 1) * auVar116._8_4_) *
                      local_4b8.values[2];
            fVar195 = (float)((uint)bVar11 * auVar102._12_4_ |
                             (uint)!bVar11 * (uint)(byte)(uVar80 >> 3) * auVar116._12_4_) *
                      local_4b8.values[3];
            local_4b8.values[0] = fVar149;
            local_4b8.values[1] = fVar187;
            local_4b8.values[2] = fVar190;
            local_4b8.values[3] = fVar195;
            if (((float)local_4a8._0_4_ < fVar107) ||
               (uVar77 = local_4d0[lVar90], uVar85 = local_3ec[lVar90 + 3],
               local_4d0[lVar90] = uVar77 + uVar85, puVar92 = local_490, puVar91 = local_498,
               uVar77 + uVar85 == local_3ec[lVar90])) break;
            auVar255 = ZEXT464((uint)local_428._0_4_);
            local_4c4[lVar90] = fVar107 + local_3d4[lVar90];
            uVar85 = *puVar92;
            uVar77 = *puVar91;
          }
        }
      }
LAB_003e6ff6:
      bVar96 = true;
      if ((local_4f6 & 1U) == 0) goto LAB_003e7029;
    }
    if (bVar96) {
      aVar70.values[1] = local_398.values.values[1];
      aVar70.values[0] = local_398.values.values[0];
      aVar70.values[2] = local_398.values.values[2];
      aVar70.values[3] = local_398.values.values[3];
      return (array<float,_4>)(array<float,_4>)aVar70.values;
    }
  } while( true );
}

Assistant:

SampledSpectrum SimpleVolPathIntegrator::Li(RayDifferential ray,
                                            SampledWavelengths &lambda,
                                            SamplerHandle sampler, ScratchBuffer &buf,
                                            VisibleSurface *) const {
    SampledSpectrum L(0.f), beta(1.f);
    int numScatters = 0;
    // Terminate secondary wavelengths before starting random walk
    lambda.TerminateSecondary();

    while (true) {
        // Estimate radiance for ray path using delta tracking
        pstd::optional<ShapeIntersection> si = Intersect(ray);
        bool scattered = false, terminated = false;
        if (ray.medium) {
            // Sample medium scattering using delta tracking
            uint64_t hash0 = Hash(sampler.Get1D());
            uint64_t hash1 = Hash(sampler.Get1D());
            RNG rng(hash0, hash1);
            Float tMax = si ? si->tHit : Infinity;
            Float u = sampler.Get1D();
            Float uMode = sampler.Get1D();
            ray.medium.SampleTmaj(ray, tMax, u, rng, lambda, [&](const MediumSample &ms) {
                const MediumInteraction &intr = ms.intr;
                // Compute medium event probabilities for interaction
                Float pAbsorb = intr.sigma_a[0] / intr.sigma_maj[0];
                Float pScatter = intr.sigma_s[0] / intr.sigma_maj[0];
                Float pNull = std::max<Float>(0, 1 - pAbsorb - pScatter);

                // Randomly sample medium scattering event for delta tracking
                int mode = SampleDiscrete({pAbsorb, pScatter, pNull}, uMode);
                if (mode == 0) {
                    // Handle absorption event for delta tracking
                    L += SafeDiv(beta * intr.Le, lambda.PDF());
                    terminated = true;
                    return false;

                } else if (mode == 1) {
                    // Handle regular scattering event for delta tracking
                    // Stop path sampling if maximum depth has been reached
                    if (numScatters++ >= maxDepth) {
                        terminated = true;
                        return false;
                    }

                    // Sample phase function for delta tracking scattering event
                    pstd::optional<PhaseFunctionSample> ps =
                        intr.phase.Sample_p(-ray.d, sampler.Get2D());
                    if (!ps) {
                        terminated = true;
                        return false;
                    }

                    // Update state for recursive $L_\roman{i}$ evaluation
                    beta *= ps->p / ps->pdf;
                    ray = intr.SpawnRay(ps->wi);
                    scattered = true;
                    return false;

                } else {
                    // Handle null scattering event for delta tracking
                    uMode = rng.Uniform<Float>();
                    return true;
                }
            });
        }
        // Handle terminated and unscattered rays after medium sampling
        if (terminated)
            return L;
        if (scattered)
            continue;
        // Add emission to un-scattered ray
        if (si)
            L += SafeDiv(beta * si->intr.Le(-ray.d, lambda), lambda.PDF());
        else {
            for (const auto &light : infiniteLights)
                L += SafeDiv(beta * light.Le(ray, lambda), lambda.PDF());
            return L;
        }

        // Handle surface intersection along delta tracking path
        BSDF bsdf = si->intr.GetBSDF(ray, lambda, camera, buf, sampler);
        if (!bsdf)
            si->intr.SkipIntersection(&ray, si->tHit);
        else {
            Float uc = sampler.Get1D();
            Point2f u = sampler.Get2D();
            if (bsdf.Sample_f(-ray.d, uc, u))
                ErrorExit("SimpleVolPathIntegrator doesn't support surface scattering.");
            else
                break;
        }
    }
    return L;
}